

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 uVar2;
  ulong uVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  byte bVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  long lVar55;
  uint uVar56;
  uint uVar58;
  ulong uVar59;
  undefined4 uVar60;
  undefined8 in_R11;
  bool bVar61;
  ulong uVar62;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar65 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar88;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar92;
  float fVar120;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar93;
  float fVar121;
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar98 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float t1;
  float fVar149;
  float fVar157;
  float fVar158;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar159;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar160;
  undefined1 auVar156 [32];
  float fVar176;
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar177;
  float fVar193;
  float fVar194;
  vint4 ai_2;
  undefined1 auVar178 [16];
  float fVar195;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar196;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar197;
  float fVar210;
  float fVar211;
  vint4 ai_1;
  undefined1 auVar198 [16];
  float fVar212;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  vfloat4 b0;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar234;
  float fVar236;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar233 [32];
  float fVar239;
  float fVar251;
  float fVar252;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar249 [32];
  float fVar253;
  undefined1 auVar250 [32];
  __m128 a;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  vfloat4 a0;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  float fVar272;
  float fVar276;
  float fVar277;
  vfloat4 a0_1;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  undefined1 auVar275 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar288;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [64];
  undefined1 auVar297 [16];
  float fVar299;
  undefined1 auVar298 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  uint auStack_4c0 [4];
  RTCFilterFunctionNArguments local_4b0;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar57;
  undefined1 auVar209 [32];
  undefined1 auVar295 [32];
  
  PVar4 = prim[1];
  uVar54 = (ulong)(byte)PVar4;
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar202 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar202 = vinsertps_avx(auVar202,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar69 = vsubps_avx(auVar69,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  fVar177 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar94._0_4_ = fVar177 * auVar69._0_4_;
  auVar94._4_4_ = fVar177 * auVar69._4_4_;
  auVar94._8_4_ = fVar177 * auVar69._8_4_;
  auVar94._12_4_ = fVar177 * auVar69._12_4_;
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar213._0_4_ = fVar177 * auVar202._0_4_;
  auVar213._4_4_ = fVar177 * auVar202._4_4_;
  auVar213._8_4_ = fVar177 * auVar202._8_4_;
  auVar213._12_4_ = fVar177 * auVar202._12_4_;
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xb + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xd + 6)));
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x12 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x13 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x14 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar63 = vshufps_avx(auVar213,auVar213,0);
  auVar95 = vshufps_avx(auVar213,auVar213,0x55);
  auVar122 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar177 = auVar122._0_4_;
  fVar149 = auVar122._4_4_;
  fVar193 = auVar122._8_4_;
  fVar157 = auVar122._12_4_;
  fVar197 = auVar95._0_4_;
  fVar210 = auVar95._4_4_;
  fVar211 = auVar95._8_4_;
  fVar212 = auVar95._12_4_;
  fVar194 = auVar63._0_4_;
  fVar158 = auVar63._4_4_;
  fVar195 = auVar63._8_4_;
  fVar159 = auVar63._12_4_;
  auVar273._0_4_ = fVar194 * auVar69._0_4_ + fVar197 * auVar202._0_4_ + fVar177 * auVar144._0_4_;
  auVar273._4_4_ = fVar158 * auVar69._4_4_ + fVar210 * auVar202._4_4_ + fVar149 * auVar144._4_4_;
  auVar273._8_4_ = fVar195 * auVar69._8_4_ + fVar211 * auVar202._8_4_ + fVar193 * auVar144._8_4_;
  auVar273._12_4_ = fVar159 * auVar69._12_4_ + fVar212 * auVar202._12_4_ + fVar157 * auVar144._12_4_
  ;
  auVar283._0_4_ = fVar194 * auVar11._0_4_ + fVar197 * auVar267._0_4_ + auVar12._0_4_ * fVar177;
  auVar283._4_4_ = fVar158 * auVar11._4_4_ + fVar210 * auVar267._4_4_ + auVar12._4_4_ * fVar149;
  auVar283._8_4_ = fVar195 * auVar11._8_4_ + fVar211 * auVar267._8_4_ + auVar12._8_4_ * fVar193;
  auVar283._12_4_ = fVar159 * auVar11._12_4_ + fVar212 * auVar267._12_4_ + auVar12._12_4_ * fVar157;
  auVar214._0_4_ = fVar194 * auVar64._0_4_ + fVar197 * auVar100._0_4_ + auVar130._0_4_ * fVar177;
  auVar214._4_4_ = fVar158 * auVar64._4_4_ + fVar210 * auVar100._4_4_ + auVar130._4_4_ * fVar149;
  auVar214._8_4_ = fVar195 * auVar64._8_4_ + fVar211 * auVar100._8_4_ + auVar130._8_4_ * fVar193;
  auVar214._12_4_ = fVar159 * auVar64._12_4_ + fVar212 * auVar100._12_4_ + auVar130._12_4_ * fVar157
  ;
  auVar63 = vshufps_avx(auVar94,auVar94,0);
  auVar95 = vshufps_avx(auVar94,auVar94,0x55);
  auVar122 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar177 = auVar122._0_4_;
  fVar149 = auVar122._4_4_;
  fVar193 = auVar122._8_4_;
  fVar157 = auVar122._12_4_;
  fVar197 = auVar95._0_4_;
  fVar210 = auVar95._4_4_;
  fVar211 = auVar95._8_4_;
  fVar212 = auVar95._12_4_;
  fVar194 = auVar63._0_4_;
  fVar158 = auVar63._4_4_;
  fVar195 = auVar63._8_4_;
  fVar159 = auVar63._12_4_;
  auVar161._0_4_ = fVar194 * auVar69._0_4_ + fVar197 * auVar202._0_4_ + fVar177 * auVar144._0_4_;
  auVar161._4_4_ = fVar158 * auVar69._4_4_ + fVar210 * auVar202._4_4_ + fVar149 * auVar144._4_4_;
  auVar161._8_4_ = fVar195 * auVar69._8_4_ + fVar211 * auVar202._8_4_ + fVar193 * auVar144._8_4_;
  auVar161._12_4_ = fVar159 * auVar69._12_4_ + fVar212 * auVar202._12_4_ + fVar157 * auVar144._12_4_
  ;
  auVar95._0_4_ = fVar194 * auVar11._0_4_ + auVar12._0_4_ * fVar177 + fVar197 * auVar267._0_4_;
  auVar95._4_4_ = fVar158 * auVar11._4_4_ + auVar12._4_4_ * fVar149 + fVar210 * auVar267._4_4_;
  auVar95._8_4_ = fVar195 * auVar11._8_4_ + auVar12._8_4_ * fVar193 + fVar211 * auVar267._8_4_;
  auVar95._12_4_ = fVar159 * auVar11._12_4_ + auVar12._12_4_ * fVar157 + fVar212 * auVar267._12_4_;
  auVar63._0_4_ = fVar197 * auVar100._0_4_ + auVar130._0_4_ * fVar177 + fVar194 * auVar64._0_4_;
  auVar63._4_4_ = fVar210 * auVar100._4_4_ + auVar130._4_4_ * fVar149 + fVar158 * auVar64._4_4_;
  auVar63._8_4_ = fVar211 * auVar100._8_4_ + auVar130._8_4_ * fVar193 + fVar195 * auVar64._8_4_;
  auVar63._12_4_ = fVar212 * auVar100._12_4_ + auVar130._12_4_ * fVar157 + fVar159 * auVar64._12_4_;
  auVar198._8_4_ = 0x7fffffff;
  auVar198._0_8_ = 0x7fffffff7fffffff;
  auVar198._12_4_ = 0x7fffffff;
  auVar69 = vandps_avx(auVar273,auVar198);
  auVar150._8_4_ = 0x219392ef;
  auVar150._0_8_ = 0x219392ef219392ef;
  auVar150._12_4_ = 0x219392ef;
  auVar69 = vcmpps_avx(auVar69,auVar150,1);
  auVar202 = vblendvps_avx(auVar273,auVar150,auVar69);
  auVar69 = vandps_avx(auVar283,auVar198);
  auVar69 = vcmpps_avx(auVar69,auVar150,1);
  auVar144 = vblendvps_avx(auVar283,auVar150,auVar69);
  auVar69 = vandps_avx(auVar214,auVar198);
  auVar69 = vcmpps_avx(auVar69,auVar150,1);
  auVar69 = vblendvps_avx(auVar214,auVar150,auVar69);
  auVar11 = vrcpps_avx(auVar202);
  fVar197 = auVar11._0_4_;
  auVar122._0_4_ = fVar197 * auVar202._0_4_;
  fVar210 = auVar11._4_4_;
  auVar122._4_4_ = fVar210 * auVar202._4_4_;
  fVar211 = auVar11._8_4_;
  auVar122._8_4_ = fVar211 * auVar202._8_4_;
  fVar212 = auVar11._12_4_;
  auVar122._12_4_ = fVar212 * auVar202._12_4_;
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = 0x3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar202 = vsubps_avx(auVar215,auVar122);
  fVar197 = fVar197 + fVar197 * auVar202._0_4_;
  fVar210 = fVar210 + fVar210 * auVar202._4_4_;
  fVar211 = fVar211 + fVar211 * auVar202._8_4_;
  fVar212 = fVar212 + fVar212 * auVar202._12_4_;
  auVar202 = vrcpps_avx(auVar144);
  fVar177 = auVar202._0_4_;
  auVar178._0_4_ = fVar177 * auVar144._0_4_;
  fVar193 = auVar202._4_4_;
  auVar178._4_4_ = fVar193 * auVar144._4_4_;
  fVar194 = auVar202._8_4_;
  auVar178._8_4_ = fVar194 * auVar144._8_4_;
  fVar195 = auVar202._12_4_;
  auVar178._12_4_ = fVar195 * auVar144._12_4_;
  auVar202 = vsubps_avx(auVar215,auVar178);
  fVar177 = fVar177 + fVar177 * auVar202._0_4_;
  fVar193 = fVar193 + fVar193 * auVar202._4_4_;
  fVar194 = fVar194 + fVar194 * auVar202._8_4_;
  fVar195 = fVar195 + fVar195 * auVar202._12_4_;
  auVar202 = vrcpps_avx(auVar69);
  fVar149 = auVar202._0_4_;
  auVar151._0_4_ = fVar149 * auVar69._0_4_;
  fVar157 = auVar202._4_4_;
  auVar151._4_4_ = fVar157 * auVar69._4_4_;
  fVar158 = auVar202._8_4_;
  auVar151._8_4_ = fVar158 * auVar69._8_4_;
  fVar159 = auVar202._12_4_;
  auVar151._12_4_ = fVar159 * auVar69._12_4_;
  auVar69 = vsubps_avx(auVar215,auVar151);
  fVar149 = fVar149 + fVar149 * auVar69._0_4_;
  fVar157 = fVar157 + fVar157 * auVar69._4_4_;
  fVar158 = fVar158 + fVar158 * auVar69._8_4_;
  fVar159 = fVar159 + fVar159 * auVar69._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar69 = vpmovsxwd_avx(auVar69);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar144 = vsubps_avx(auVar69,auVar161);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar69 = vpmovsxwd_avx(auVar202);
  auVar123._0_4_ = fVar197 * auVar144._0_4_;
  auVar123._4_4_ = fVar210 * auVar144._4_4_;
  auVar123._8_4_ = fVar211 * auVar144._8_4_;
  auVar123._12_4_ = fVar212 * auVar144._12_4_;
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar161);
  auVar162._0_4_ = fVar197 * auVar69._0_4_;
  auVar162._4_4_ = fVar210 * auVar69._4_4_;
  auVar162._8_4_ = fVar211 * auVar69._8_4_;
  auVar162._12_4_ = fVar212 * auVar69._12_4_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar54 * 0xe + 6);
  auVar69 = vpmovsxwd_avx(auVar144);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar202 = vsubps_avx(auVar69,auVar95);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar69 = vpmovsxwd_avx(auVar11);
  auVar199._0_4_ = auVar202._0_4_ * fVar177;
  auVar199._4_4_ = auVar202._4_4_ * fVar193;
  auVar199._8_4_ = auVar202._8_4_ * fVar194;
  auVar199._12_4_ = auVar202._12_4_ * fVar195;
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar95);
  auVar130._0_4_ = fVar177 * auVar69._0_4_;
  auVar130._4_4_ = fVar193 * auVar69._4_4_;
  auVar130._8_4_ = fVar194 * auVar69._8_4_;
  auVar130._12_4_ = fVar195 * auVar69._12_4_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + uVar54 * 0x15 + 6);
  auVar69 = vpmovsxwd_avx(auVar267);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar63);
  auVar179._0_4_ = auVar69._0_4_ * fVar149;
  auVar179._4_4_ = auVar69._4_4_ * fVar157;
  auVar179._8_4_ = auVar69._8_4_ * fVar158;
  auVar179._12_4_ = auVar69._12_4_ * fVar159;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar54 * 0x17 + 6);
  auVar69 = vpmovsxwd_avx(auVar12);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar63);
  auVar64._0_4_ = auVar69._0_4_ * fVar149;
  auVar64._4_4_ = auVar69._4_4_ * fVar157;
  auVar64._8_4_ = auVar69._8_4_ * fVar158;
  auVar64._12_4_ = auVar69._12_4_ * fVar159;
  auVar69 = vpminsd_avx(auVar123,auVar162);
  auVar202 = vpminsd_avx(auVar199,auVar130);
  auVar69 = vmaxps_avx(auVar69,auVar202);
  auVar202 = vpminsd_avx(auVar179,auVar64);
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar240._4_4_ = uVar60;
  auVar240._0_4_ = uVar60;
  auVar240._8_4_ = uVar60;
  auVar240._12_4_ = uVar60;
  auVar202 = vmaxps_avx(auVar202,auVar240);
  auVar69 = vmaxps_avx(auVar69,auVar202);
  local_430._0_4_ = auVar69._0_4_ * 0.99999964;
  local_430._4_4_ = auVar69._4_4_ * 0.99999964;
  local_430._8_4_ = auVar69._8_4_ * 0.99999964;
  local_430._12_4_ = auVar69._12_4_ * 0.99999964;
  auVar69 = vpmaxsd_avx(auVar123,auVar162);
  auVar202 = vpmaxsd_avx(auVar199,auVar130);
  auVar69 = vminps_avx(auVar69,auVar202);
  auVar202 = vpmaxsd_avx(auVar179,auVar64);
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar60;
  auVar124._0_4_ = uVar60;
  auVar124._8_4_ = uVar60;
  auVar124._12_4_ = uVar60;
  auVar202 = vminps_avx(auVar202,auVar124);
  auVar69 = vminps_avx(auVar69,auVar202);
  auVar100._0_4_ = auVar69._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar69._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar69._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar69._12_4_ * 1.0000004;
  auVar69 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar202 = vpcmpgtd_avx(auVar69,_DAT_01f4ad30);
  auVar69 = vcmpps_avx(local_430,auVar100,2);
  auVar69 = vandps_avx(auVar69,auVar202);
  uVar60 = vmovmskps_avx(auVar69);
  uVar54 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar60);
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  uVar58 = 1 << ((byte)k & 0x1f);
LAB_007d33bb:
  if (uVar54 == 0) {
LAB_007d535d:
    return uVar54 != 0;
  }
  lVar55 = 0;
  if (uVar54 != 0) {
    for (; (uVar54 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
    }
  }
  uVar53 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar53].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar55 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar69 = *(undefined1 (*) [16])(_Var8 + uVar59 * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (uVar59 + 1) * (long)pvVar7);
  fVar177 = *pfVar1;
  fVar149 = pfVar1[1];
  fVar193 = pfVar1[2];
  fVar157 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar59 + 2) * (long)pvVar7);
  fVar194 = *pfVar1;
  fVar158 = pfVar1[1];
  fVar195 = pfVar1[2];
  fVar159 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar59 + 3));
  fVar197 = *pfVar1;
  fVar210 = pfVar1[1];
  fVar211 = pfVar1[2];
  fVar212 = pfVar1[3];
  lVar9 = *(long *)&pGVar5[1].time_range.upper;
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * uVar59);
  fVar92 = *pfVar1;
  fVar93 = pfVar1[1];
  fVar120 = pfVar1[2];
  fVar121 = pfVar1[3];
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * (uVar59 + 1));
  fVar88 = *pfVar1;
  fVar89 = pfVar1[1];
  fVar90 = pfVar1[2];
  fVar91 = pfVar1[3];
  uVar62 = uVar54 - 1 & uVar54;
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * (uVar59 + 2));
  fVar160 = *pfVar1;
  fVar196 = pfVar1[1];
  fVar176 = pfVar1[2];
  fVar224 = pfVar1[3];
  lVar10 = 0;
  if (uVar62 != 0) {
    for (; (uVar62 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar1 = (float *)(lVar9 + (long)p_Var6 * (uVar59 + 3));
  fVar234 = *pfVar1;
  fVar235 = pfVar1[1];
  fVar272 = pfVar1[2];
  fVar236 = pfVar1[3];
  if (((uVar62 != 0) && (uVar59 = uVar62 - 1 & uVar62, uVar59 != 0)) && (lVar9 = 0, uVar59 != 0)) {
    for (; (uVar59 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar202 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar144 = vinsertps_avx(auVar202,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_720._0_4_ = fVar92 * 0.16666667 + fVar88 * 0.6666667 + fVar160 * 0.16666667 + fVar234 * 0.0;
  local_720._4_4_ = fVar93 * 0.16666667 + fVar89 * 0.6666667 + fVar196 * 0.16666667 + fVar235 * 0.0;
  fStack_718 = fVar120 * 0.16666667 + fVar90 * 0.6666667 + fVar176 * 0.16666667 + fVar272 * 0.0;
  fStack_714 = fVar121 * 0.16666667 + fVar91 * 0.6666667 + fVar224 * 0.16666667 + fVar236 * 0.0;
  auVar125._0_4_ = fVar160 * 0.5 + fVar234 * 0.0;
  auVar125._4_4_ = fVar196 * 0.5 + fVar235 * 0.0;
  auVar125._8_4_ = fVar176 * 0.5 + fVar272 * 0.0;
  auVar125._12_4_ = fVar224 * 0.5 + fVar236 * 0.0;
  auVar264._0_4_ = fVar88 * 0.0;
  auVar264._4_4_ = fVar89 * 0.0;
  auVar264._8_4_ = fVar90 * 0.0;
  auVar264._12_4_ = fVar91 * 0.0;
  auVar202 = vsubps_avx(auVar125,auVar264);
  auVar265._0_4_ = fVar92 * 0.5;
  auVar265._4_4_ = fVar93 * 0.5;
  auVar265._8_4_ = fVar120 * 0.5;
  auVar265._12_4_ = fVar121 * 0.5;
  auVar130 = vsubps_avx(auVar202,auVar265);
  fVar276 = auVar69._0_4_;
  fVar237 = auVar69._4_4_;
  fVar277 = auVar69._8_4_;
  fVar238 = auVar69._12_4_;
  auVar266._0_4_ = fVar276 * 0.16666667 + fVar177 * 0.6666667 + fVar194 * 0.16666667 + fVar197 * 0.0
  ;
  auVar266._4_4_ = fVar237 * 0.16666667 + fVar149 * 0.6666667 + fVar158 * 0.16666667 + fVar210 * 0.0
  ;
  auVar266._8_4_ = fVar277 * 0.16666667 + fVar193 * 0.6666667 + fVar195 * 0.16666667 + fVar211 * 0.0
  ;
  auVar266._12_4_ =
       fVar238 * 0.16666667 + fVar157 * 0.6666667 + fVar159 * 0.16666667 + fVar212 * 0.0;
  auVar274._0_4_ = fVar194 * 0.5 + fVar197 * 0.0;
  auVar274._4_4_ = fVar158 * 0.5 + fVar210 * 0.0;
  auVar274._8_4_ = fVar195 * 0.5 + fVar211 * 0.0;
  auVar274._12_4_ = fVar159 * 0.5 + fVar212 * 0.0;
  auVar284._0_4_ = fVar177 * 0.0;
  auVar284._4_4_ = fVar149 * 0.0;
  auVar284._8_4_ = fVar193 * 0.0;
  auVar284._12_4_ = fVar157 * 0.0;
  auVar69 = vsubps_avx(auVar274,auVar284);
  auVar285._0_4_ = fVar276 * 0.5;
  auVar285._4_4_ = fVar237 * 0.5;
  auVar285._8_4_ = fVar277 * 0.5;
  auVar285._12_4_ = fVar238 * 0.5;
  auVar267 = vsubps_avx(auVar69,auVar285);
  auVar289._0_4_ = fVar92 * 0.0;
  auVar289._4_4_ = fVar93 * 0.0;
  auVar289._8_4_ = fVar120 * 0.0;
  auVar289._12_4_ = fVar121 * 0.0;
  local_6c0._0_4_ =
       auVar289._0_4_ + fVar88 * 0.16666667 + fVar160 * 0.6666667 + fVar234 * 0.16666667;
  local_6c0._4_4_ =
       auVar289._4_4_ + fVar89 * 0.16666667 + fVar196 * 0.6666667 + fVar235 * 0.16666667;
  fStack_6b8 = auVar289._8_4_ + fVar90 * 0.16666667 + fVar176 * 0.6666667 + fVar272 * 0.16666667;
  fStack_6b4 = auVar289._12_4_ + fVar91 * 0.16666667 + fVar224 * 0.6666667 + fVar236 * 0.16666667;
  auVar241._0_4_ = fVar160 * 0.0 + fVar234 * 0.5;
  auVar241._4_4_ = fVar196 * 0.0 + fVar235 * 0.5;
  auVar241._8_4_ = fVar176 * 0.0 + fVar272 * 0.5;
  auVar241._12_4_ = fVar224 * 0.0 + fVar236 * 0.5;
  auVar163._0_4_ = fVar88 * 0.5;
  auVar163._4_4_ = fVar89 * 0.5;
  auVar163._8_4_ = fVar90 * 0.5;
  auVar163._12_4_ = fVar91 * 0.5;
  auVar69 = vsubps_avx(auVar241,auVar163);
  auVar63 = vsubps_avx(auVar69,auVar289);
  auVar200._0_4_ = fVar276 * 0.0;
  auVar200._4_4_ = fVar237 * 0.0;
  auVar200._8_4_ = fVar277 * 0.0;
  auVar200._12_4_ = fVar238 * 0.0;
  auVar242._0_4_ =
       fVar177 * 0.16666667 + fVar194 * 0.6666667 + fVar197 * 0.16666667 + auVar200._0_4_;
  auVar242._4_4_ =
       fVar149 * 0.16666667 + fVar158 * 0.6666667 + fVar210 * 0.16666667 + auVar200._4_4_;
  auVar242._8_4_ =
       fVar193 * 0.16666667 + fVar195 * 0.6666667 + fVar211 * 0.16666667 + auVar200._8_4_;
  auVar242._12_4_ =
       fVar157 * 0.16666667 + fVar159 * 0.6666667 + fVar212 * 0.16666667 + auVar200._12_4_;
  auVar216._0_4_ = fVar197 * 0.5 + fVar194 * 0.0;
  auVar216._4_4_ = fVar210 * 0.5 + fVar158 * 0.0;
  auVar216._8_4_ = fVar211 * 0.5 + fVar195 * 0.0;
  auVar216._12_4_ = fVar212 * 0.5 + fVar159 * 0.0;
  auVar180._0_4_ = fVar177 * 0.5;
  auVar180._4_4_ = fVar149 * 0.5;
  auVar180._8_4_ = fVar193 * 0.5;
  auVar180._12_4_ = fVar157 * 0.5;
  auVar69 = vsubps_avx(auVar216,auVar180);
  auVar64 = vsubps_avx(auVar69,auVar200);
  auVar69 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar202 = vshufps_avx(auVar266,auVar266,0xc9);
  fVar88 = auVar130._0_4_;
  auVar217._0_4_ = fVar88 * auVar202._0_4_;
  fVar89 = auVar130._4_4_;
  auVar217._4_4_ = fVar89 * auVar202._4_4_;
  fVar90 = auVar130._8_4_;
  auVar217._8_4_ = fVar90 * auVar202._8_4_;
  fVar91 = auVar130._12_4_;
  auVar217._12_4_ = fVar91 * auVar202._12_4_;
  auVar225._0_4_ = auVar266._0_4_ * auVar69._0_4_;
  auVar225._4_4_ = auVar266._4_4_ * auVar69._4_4_;
  auVar225._8_4_ = auVar266._8_4_ * auVar69._8_4_;
  auVar225._12_4_ = auVar266._12_4_ * auVar69._12_4_;
  auVar202 = vsubps_avx(auVar225,auVar217);
  auVar11 = vshufps_avx(auVar202,auVar202,0xc9);
  auVar202 = vshufps_avx(auVar267,auVar267,0xc9);
  auVar218._0_4_ = fVar88 * auVar202._0_4_;
  auVar218._4_4_ = fVar89 * auVar202._4_4_;
  auVar218._8_4_ = fVar90 * auVar202._8_4_;
  auVar218._12_4_ = fVar91 * auVar202._12_4_;
  auVar181._0_4_ = auVar267._0_4_ * auVar69._0_4_;
  auVar181._4_4_ = auVar267._4_4_ * auVar69._4_4_;
  auVar181._8_4_ = auVar267._8_4_ * auVar69._8_4_;
  auVar181._12_4_ = auVar267._12_4_ * auVar69._12_4_;
  auVar69 = vsubps_avx(auVar181,auVar218);
  auVar267 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar202 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar69 = vshufps_avx(auVar242,auVar242,0xc9);
  fVar160 = auVar63._0_4_;
  auVar182._0_4_ = fVar160 * auVar69._0_4_;
  fVar196 = auVar63._4_4_;
  auVar182._4_4_ = fVar196 * auVar69._4_4_;
  fVar176 = auVar63._8_4_;
  auVar182._8_4_ = fVar176 * auVar69._8_4_;
  fVar224 = auVar63._12_4_;
  auVar182._12_4_ = fVar224 * auVar69._12_4_;
  auVar243._0_4_ = auVar242._0_4_ * auVar202._0_4_;
  auVar243._4_4_ = auVar242._4_4_ * auVar202._4_4_;
  auVar243._8_4_ = auVar242._8_4_ * auVar202._8_4_;
  auVar243._12_4_ = auVar242._12_4_ * auVar202._12_4_;
  auVar69 = vsubps_avx(auVar243,auVar182);
  auVar12 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar69 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar244._0_4_ = auVar69._0_4_ * fVar160;
  auVar244._4_4_ = auVar69._4_4_ * fVar196;
  auVar244._8_4_ = auVar69._8_4_ * fVar176;
  auVar244._12_4_ = auVar69._12_4_ * fVar224;
  auVar69 = vdpps_avx(auVar11,auVar11,0x7f);
  auVar201._0_4_ = auVar202._0_4_ * auVar64._0_4_;
  auVar201._4_4_ = auVar202._4_4_ * auVar64._4_4_;
  auVar201._8_4_ = auVar202._8_4_ * auVar64._8_4_;
  auVar201._12_4_ = auVar202._12_4_ * auVar64._12_4_;
  auVar202 = vsubps_avx(auVar201,auVar244);
  auVar64 = vshufps_avx(auVar202,auVar202,0xc9);
  fVar194 = auVar69._0_4_;
  auVar122 = ZEXT416((uint)fVar194);
  auVar202 = vrsqrtss_avx(auVar122,auVar122);
  fVar177 = auVar202._0_4_;
  auVar202 = ZEXT416((uint)(fVar177 * 1.5 - fVar194 * 0.5 * fVar177 * fVar177 * fVar177));
  auVar100 = vshufps_avx(auVar202,auVar202,0);
  auVar202 = vdpps_avx(auVar11,auVar267,0x7f);
  fVar177 = auVar11._0_4_ * auVar100._0_4_;
  fVar149 = auVar11._4_4_ * auVar100._4_4_;
  fVar193 = auVar11._8_4_ * auVar100._8_4_;
  fVar157 = auVar11._12_4_ * auVar100._12_4_;
  auVar69 = vshufps_avx(auVar69,auVar69,0);
  auVar257._0_4_ = auVar267._0_4_ * auVar69._0_4_;
  auVar257._4_4_ = auVar267._4_4_ * auVar69._4_4_;
  auVar257._8_4_ = auVar267._8_4_ * auVar69._8_4_;
  auVar257._12_4_ = auVar267._12_4_ * auVar69._12_4_;
  auVar69 = vshufps_avx(auVar202,auVar202,0);
  auVar226._0_4_ = auVar11._0_4_ * auVar69._0_4_;
  auVar226._4_4_ = auVar11._4_4_ * auVar69._4_4_;
  auVar226._8_4_ = auVar11._8_4_ * auVar69._8_4_;
  auVar226._12_4_ = auVar11._12_4_ * auVar69._12_4_;
  auVar95 = vsubps_avx(auVar257,auVar226);
  auVar69 = vrcpss_avx(auVar122,auVar122);
  auVar69 = ZEXT416((uint)(auVar69._0_4_ * (2.0 - fVar194 * auVar69._0_4_)));
  auVar11 = vshufps_avx(auVar69,auVar69,0);
  auVar69 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar194 = auVar69._0_4_;
  auVar122 = ZEXT416((uint)fVar194);
  auVar202 = vrsqrtss_avx(auVar122,auVar122);
  fVar158 = auVar202._0_4_;
  auVar202 = vdpps_avx(auVar12,auVar64,0x7f);
  auVar267 = ZEXT416((uint)(fVar158 * 1.5 - fVar194 * 0.5 * fVar158 * fVar158 * fVar158));
  auVar267 = vshufps_avx(auVar267,auVar267,0);
  fVar158 = auVar267._0_4_ * auVar12._0_4_;
  fVar195 = auVar267._4_4_ * auVar12._4_4_;
  fVar159 = auVar267._8_4_ * auVar12._8_4_;
  fVar197 = auVar267._12_4_ * auVar12._12_4_;
  auVar69 = vshufps_avx(auVar69,auVar69,0);
  auVar219._0_4_ = auVar69._0_4_ * auVar64._0_4_;
  auVar219._4_4_ = auVar69._4_4_ * auVar64._4_4_;
  auVar219._8_4_ = auVar69._8_4_ * auVar64._8_4_;
  auVar219._12_4_ = auVar69._12_4_ * auVar64._12_4_;
  auVar69 = vshufps_avx(auVar202,auVar202,0);
  auVar183._0_4_ = auVar69._0_4_ * auVar12._0_4_;
  auVar183._4_4_ = auVar69._4_4_ * auVar12._4_4_;
  auVar183._8_4_ = auVar69._8_4_ * auVar12._8_4_;
  auVar183._12_4_ = auVar69._12_4_ * auVar12._12_4_;
  auVar64 = vsubps_avx(auVar219,auVar183);
  auVar69 = vrcpss_avx(auVar122,auVar122);
  auVar69 = ZEXT416((uint)((2.0 - fVar194 * auVar69._0_4_) * auVar69._0_4_));
  auVar69 = vshufps_avx(auVar69,auVar69,0);
  auVar202 = vshufps_avx(_local_720,_local_720,0xff);
  auVar245._0_4_ = auVar202._0_4_ * fVar177;
  auVar245._4_4_ = auVar202._4_4_ * fVar149;
  auVar245._8_4_ = auVar202._8_4_ * fVar193;
  auVar245._12_4_ = auVar202._12_4_ * fVar157;
  _local_4d0 = vsubps_avx(_local_720,auVar245);
  auVar12 = vshufps_avx(auVar130,auVar130,0xff);
  auVar203._0_4_ =
       auVar12._0_4_ * fVar177 + auVar100._0_4_ * auVar95._0_4_ * auVar11._0_4_ * auVar202._0_4_;
  auVar203._4_4_ =
       auVar12._4_4_ * fVar149 + auVar100._4_4_ * auVar95._4_4_ * auVar11._4_4_ * auVar202._4_4_;
  auVar203._8_4_ =
       auVar12._8_4_ * fVar193 + auVar100._8_4_ * auVar95._8_4_ * auVar11._8_4_ * auVar202._8_4_;
  auVar203._12_4_ =
       auVar12._12_4_ * fVar157 +
       auVar100._12_4_ * auVar95._12_4_ * auVar11._12_4_ * auVar202._12_4_;
  auVar12 = vsubps_avx(auVar130,auVar203);
  local_4e0._0_4_ = auVar245._0_4_ + (float)local_720._0_4_;
  local_4e0._4_4_ = auVar245._4_4_ + (float)local_720._4_4_;
  fStack_4d8 = auVar245._8_4_ + fStack_718;
  fStack_4d4 = auVar245._12_4_ + fStack_714;
  auVar202 = vshufps_avx(_local_6c0,_local_6c0,0xff);
  auVar126._0_4_ = fVar158 * auVar202._0_4_;
  auVar126._4_4_ = fVar195 * auVar202._4_4_;
  auVar126._8_4_ = fVar159 * auVar202._8_4_;
  auVar126._12_4_ = fVar197 * auVar202._12_4_;
  _local_4f0 = vsubps_avx(_local_6c0,auVar126);
  auVar11 = vshufps_avx(auVar63,auVar63,0xff);
  auVar96._0_4_ =
       fVar158 * auVar11._0_4_ + auVar202._0_4_ * auVar267._0_4_ * auVar64._0_4_ * auVar69._0_4_;
  auVar96._4_4_ =
       fVar195 * auVar11._4_4_ + auVar202._4_4_ * auVar267._4_4_ * auVar64._4_4_ * auVar69._4_4_;
  auVar96._8_4_ =
       fVar159 * auVar11._8_4_ + auVar202._8_4_ * auVar267._8_4_ * auVar64._8_4_ * auVar69._8_4_;
  auVar96._12_4_ =
       fVar197 * auVar11._12_4_ +
       auVar202._12_4_ * auVar267._12_4_ * auVar64._12_4_ * auVar69._12_4_;
  auVar267 = vsubps_avx(auVar63,auVar96);
  local_500._0_4_ = (float)local_6c0._0_4_ + auVar126._0_4_;
  local_500._4_4_ = (float)local_6c0._4_4_ + auVar126._4_4_;
  fStack_4f8 = fStack_6b8 + auVar126._8_4_;
  fStack_4f4 = fStack_6b4 + auVar126._12_4_;
  local_510._0_4_ = local_4d0._0_4_ + auVar12._0_4_ * 0.33333334;
  local_510._4_4_ = local_4d0._4_4_ + auVar12._4_4_ * 0.33333334;
  fStack_508 = local_4d0._8_4_ + auVar12._8_4_ * 0.33333334;
  fStack_504 = local_4d0._12_4_ + auVar12._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx(_local_4d0,auVar144);
  auVar202 = vmovsldup_avx(local_3a0);
  auVar69 = vmovshdup_avx(local_3a0);
  auVar11 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar177 = pre->ray_space[k].vx.field_0.m128[0];
  fVar149 = pre->ray_space[k].vx.field_0.m128[1];
  fVar193 = pre->ray_space[k].vx.field_0.m128[2];
  fVar157 = pre->ray_space[k].vx.field_0.m128[3];
  fVar194 = pre->ray_space[k].vy.field_0.m128[0];
  fVar158 = pre->ray_space[k].vy.field_0.m128[1];
  fVar195 = pre->ray_space[k].vy.field_0.m128[2];
  fVar159 = pre->ray_space[k].vy.field_0.m128[3];
  fVar197 = pre->ray_space[k].vz.field_0.m128[0];
  fVar210 = pre->ray_space[k].vz.field_0.m128[1];
  fVar211 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  fVar92 = fVar177 * auVar202._0_4_ + auVar11._0_4_ * fVar197 + fVar194 * auVar69._0_4_;
  fVar120 = fVar149 * auVar202._4_4_ + auVar11._4_4_ * fVar210 + fVar158 * auVar69._4_4_;
  local_720._4_4_ = fVar120;
  local_720._0_4_ = fVar92;
  fStack_718 = fVar193 * auVar202._8_4_ + auVar11._8_4_ * fVar211 + fVar195 * auVar69._8_4_;
  fStack_714 = fVar157 * auVar202._12_4_ + auVar11._12_4_ * fVar212 + fVar159 * auVar69._12_4_;
  local_3b0 = vsubps_avx(_local_510,auVar144);
  auVar11 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar69 = vmovshdup_avx(local_3b0);
  auVar202 = vmovsldup_avx(local_3b0);
  fVar93 = auVar202._0_4_ * fVar177 + auVar69._0_4_ * fVar194 + fVar197 * auVar11._0_4_;
  fVar121 = auVar202._4_4_ * fVar149 + auVar69._4_4_ * fVar158 + fVar210 * auVar11._4_4_;
  local_690._4_4_ = fVar121;
  local_690._0_4_ = fVar93;
  fStack_688 = auVar202._8_4_ * fVar193 + auVar69._8_4_ * fVar195 + fVar211 * auVar11._8_4_;
  fStack_684 = auVar202._12_4_ * fVar157 + auVar69._12_4_ * fVar159 + fVar212 * auVar11._12_4_;
  auVar184._0_4_ = auVar267._0_4_ * 0.33333334;
  auVar184._4_4_ = auVar267._4_4_ * 0.33333334;
  auVar184._8_4_ = auVar267._8_4_ * 0.33333334;
  auVar184._12_4_ = auVar267._12_4_ * 0.33333334;
  _local_520 = vsubps_avx(_local_4f0,auVar184);
  local_3c0 = vsubps_avx(_local_520,auVar144);
  auVar11 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar69 = vmovshdup_avx(local_3c0);
  auVar202 = vmovsldup_avx(local_3c0);
  auVar290._0_4_ = auVar202._0_4_ * fVar177 + auVar69._0_4_ * fVar194 + fVar197 * auVar11._0_4_;
  auVar290._4_4_ = auVar202._4_4_ * fVar149 + auVar69._4_4_ * fVar158 + fVar210 * auVar11._4_4_;
  auVar290._8_4_ = auVar202._8_4_ * fVar193 + auVar69._8_4_ * fVar195 + fVar211 * auVar11._8_4_;
  auVar290._12_4_ = auVar202._12_4_ * fVar157 + auVar69._12_4_ * fVar159 + fVar212 * auVar11._12_4_;
  local_3d0 = vsubps_avx(_local_4f0,auVar144);
  auVar11 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar69 = vmovshdup_avx(local_3d0);
  auVar202 = vmovsldup_avx(local_3d0);
  auVar286._0_4_ = auVar202._0_4_ * fVar177 + auVar69._0_4_ * fVar194 + auVar11._0_4_ * fVar197;
  auVar286._4_4_ = auVar202._4_4_ * fVar149 + auVar69._4_4_ * fVar158 + auVar11._4_4_ * fVar210;
  auVar286._8_4_ = auVar202._8_4_ * fVar193 + auVar69._8_4_ * fVar195 + auVar11._8_4_ * fVar211;
  auVar286._12_4_ = auVar202._12_4_ * fVar157 + auVar69._12_4_ * fVar159 + auVar11._12_4_ * fVar212;
  local_3e0 = vsubps_avx(_local_4e0,auVar144);
  auVar11 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar69 = vmovshdup_avx(local_3e0);
  auVar202 = vmovsldup_avx(local_3e0);
  auVar258._0_4_ = auVar202._0_4_ * fVar177 + auVar69._0_4_ * fVar194 + auVar11._0_4_ * fVar197;
  auVar258._4_4_ = auVar202._4_4_ * fVar149 + auVar69._4_4_ * fVar158 + auVar11._4_4_ * fVar210;
  auVar258._8_4_ = auVar202._8_4_ * fVar193 + auVar69._8_4_ * fVar195 + auVar11._8_4_ * fVar211;
  auVar258._12_4_ = auVar202._12_4_ * fVar157 + auVar69._12_4_ * fVar159 + auVar11._12_4_ * fVar212;
  local_530._0_4_ = (float)local_4e0._0_4_ + (fVar88 + auVar203._0_4_) * 0.33333334;
  local_530._4_4_ = (float)local_4e0._4_4_ + (fVar89 + auVar203._4_4_) * 0.33333334;
  fStack_528 = fStack_4d8 + (fVar90 + auVar203._8_4_) * 0.33333334;
  fStack_524 = fStack_4d4 + (fVar91 + auVar203._12_4_) * 0.33333334;
  local_3f0 = vsubps_avx(_local_530,auVar144);
  auVar11 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar69 = vmovshdup_avx(local_3f0);
  auVar202 = vmovsldup_avx(local_3f0);
  auVar227._0_4_ = auVar202._0_4_ * fVar177 + auVar69._0_4_ * fVar194 + auVar11._0_4_ * fVar197;
  auVar227._4_4_ = auVar202._4_4_ * fVar149 + auVar69._4_4_ * fVar158 + auVar11._4_4_ * fVar210;
  auVar227._8_4_ = auVar202._8_4_ * fVar193 + auVar69._8_4_ * fVar195 + auVar11._8_4_ * fVar211;
  auVar227._12_4_ = auVar202._12_4_ * fVar157 + auVar69._12_4_ * fVar159 + auVar11._12_4_ * fVar212;
  auVar220._0_4_ = (fVar160 + auVar96._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar196 + auVar96._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar176 + auVar96._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar224 + auVar96._12_4_) * 0.33333334;
  _local_440 = vsubps_avx(_local_500,auVar220);
  local_400 = vsubps_avx(_local_440,auVar144);
  auVar11 = vshufps_avx(local_400,local_400,0xaa);
  auVar69 = vmovshdup_avx(local_400);
  auVar202 = vmovsldup_avx(local_400);
  auVar246._0_4_ = auVar202._0_4_ * fVar177 + auVar69._0_4_ * fVar194 + fVar197 * auVar11._0_4_;
  auVar246._4_4_ = auVar202._4_4_ * fVar149 + auVar69._4_4_ * fVar158 + fVar210 * auVar11._4_4_;
  auVar246._8_4_ = auVar202._8_4_ * fVar193 + auVar69._8_4_ * fVar195 + fVar211 * auVar11._8_4_;
  auVar246._12_4_ = auVar202._12_4_ * fVar157 + auVar69._12_4_ * fVar159 + fVar212 * auVar11._12_4_;
  local_410 = vsubps_avx(_local_500,auVar144);
  auVar144 = vshufps_avx(local_410,local_410,0xaa);
  auVar69 = vmovshdup_avx(local_410);
  auVar202 = vmovsldup_avx(local_410);
  auVar97._0_4_ = fVar177 * auVar202._0_4_ + fVar194 * auVar69._0_4_ + fVar197 * auVar144._0_4_;
  auVar97._4_4_ = fVar149 * auVar202._4_4_ + fVar158 * auVar69._4_4_ + fVar210 * auVar144._4_4_;
  auVar97._8_4_ = fVar193 * auVar202._8_4_ + fVar195 * auVar69._8_4_ + fVar211 * auVar144._8_4_;
  auVar97._12_4_ = fVar157 * auVar202._12_4_ + fVar159 * auVar69._12_4_ + fVar212 * auVar144._12_4_;
  auVar11 = vmovlhps_avx(_local_720,auVar258);
  auVar267 = vmovlhps_avx(_local_690,auVar227);
  auVar12 = vmovlhps_avx(auVar290,auVar246);
  _local_380 = vmovlhps_avx(auVar286,auVar97);
  auVar69 = vminps_avx(auVar11,auVar267);
  auVar202 = vminps_avx(auVar12,_local_380);
  auVar144 = vminps_avx(auVar69,auVar202);
  auVar69 = vmaxps_avx(auVar11,auVar267);
  auVar202 = vmaxps_avx(auVar12,_local_380);
  auVar69 = vmaxps_avx(auVar69,auVar202);
  auVar202 = vshufpd_avx(auVar144,auVar144,3);
  auVar144 = vminps_avx(auVar144,auVar202);
  auVar202 = vshufpd_avx(auVar69,auVar69,3);
  auVar202 = vmaxps_avx(auVar69,auVar202);
  auVar204._8_4_ = 0x7fffffff;
  auVar204._0_8_ = 0x7fffffff7fffffff;
  auVar204._12_4_ = 0x7fffffff;
  auVar69 = vandps_avx(auVar144,auVar204);
  auVar202 = vandps_avx(auVar202,auVar204);
  auVar69 = vmaxps_avx(auVar69,auVar202);
  auVar202 = vmovshdup_avx(auVar69);
  auVar69 = vmaxss_avx(auVar202,auVar69);
  fVar177 = auVar69._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar177);
  auVar69 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
  local_1c0._16_16_ = auVar69;
  local_1c0._0_16_ = auVar69;
  auVar65._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
  auVar65._8_4_ = auVar69._8_4_ ^ 0x80000000;
  auVar65._12_4_ = auVar69._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar65;
  local_1e0._0_16_ = auVar65;
  auVar69 = vpshufd_avx(ZEXT416(uVar53),0);
  local_300._16_16_ = auVar69;
  local_300._0_16_ = auVar69;
  auVar69 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar55 * 4 + 6)),0);
  local_320._16_16_ = auVar69;
  local_320._0_16_ = auVar69;
  bVar61 = false;
  uVar59 = 0;
  fVar177 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar267,auVar11);
  _local_360 = vsubps_avx(auVar12,auVar267);
  _local_370 = vsubps_avx(_local_380,auVar12);
  _local_450 = vsubps_avx(_local_4e0,_local_4d0);
  _local_460 = vsubps_avx(_local_530,_local_510);
  _local_470 = vsubps_avx(_local_440,_local_520);
  _local_480 = vsubps_avx(_local_500,_local_4f0);
  auVar296 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar298 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_007d3c73:
  local_420 = auVar298._0_16_;
  auVar123 = auVar296._0_16_;
  auVar69 = vshufps_avx(auVar123,auVar123,0x50);
  auVar291._8_4_ = 0x3f800000;
  auVar291._0_8_ = 0x3f8000003f800000;
  auVar291._12_4_ = 0x3f800000;
  auVar295._16_4_ = 0x3f800000;
  auVar295._0_16_ = auVar291;
  auVar295._20_4_ = 0x3f800000;
  auVar295._24_4_ = 0x3f800000;
  auVar295._28_4_ = 0x3f800000;
  auVar202 = vsubps_avx(auVar291,auVar69);
  fVar149 = auVar69._0_4_;
  fVar193 = auVar69._4_4_;
  fVar157 = auVar69._8_4_;
  fVar194 = auVar69._12_4_;
  fVar158 = auVar202._0_4_;
  fVar195 = auVar202._4_4_;
  fVar159 = auVar202._8_4_;
  fVar197 = auVar202._12_4_;
  auVar152._0_4_ = auVar258._0_4_ * fVar149 + fVar158 * fVar92;
  auVar152._4_4_ = auVar258._4_4_ * fVar193 + fVar195 * fVar120;
  auVar152._8_4_ = auVar258._0_4_ * fVar157 + fVar159 * fVar92;
  auVar152._12_4_ = auVar258._4_4_ * fVar194 + fVar197 * fVar120;
  auVar127._0_4_ = auVar227._0_4_ * fVar149 + fVar158 * fVar93;
  auVar127._4_4_ = auVar227._4_4_ * fVar193 + fVar195 * fVar121;
  auVar127._8_4_ = auVar227._0_4_ * fVar157 + fVar159 * fVar93;
  auVar127._12_4_ = auVar227._4_4_ * fVar194 + fVar197 * fVar121;
  auVar221._0_4_ = auVar246._0_4_ * fVar149 + auVar290._0_4_ * fVar158;
  auVar221._4_4_ = auVar246._4_4_ * fVar193 + auVar290._4_4_ * fVar195;
  auVar221._8_4_ = auVar246._0_4_ * fVar157 + auVar290._0_4_ * fVar159;
  auVar221._12_4_ = auVar246._4_4_ * fVar194 + auVar290._4_4_ * fVar197;
  auVar164._0_4_ = auVar97._0_4_ * fVar149 + auVar286._0_4_ * fVar158;
  auVar164._4_4_ = auVar97._4_4_ * fVar193 + auVar286._4_4_ * fVar195;
  auVar164._8_4_ = auVar97._0_4_ * fVar157 + auVar286._0_4_ * fVar159;
  auVar164._12_4_ = auVar97._4_4_ * fVar194 + auVar286._4_4_ * fVar197;
  auVar69 = vmovshdup_avx(local_420);
  auVar202 = vshufps_avx(local_420,local_420,0);
  auVar249._16_16_ = auVar202;
  auVar249._0_16_ = auVar202;
  auVar144 = vshufps_avx(local_420,local_420,0x55);
  auVar82._16_16_ = auVar144;
  auVar82._0_16_ = auVar144;
  auVar81 = vsubps_avx(auVar82,auVar249);
  auVar144 = vshufps_avx(auVar152,auVar152,0);
  auVar64 = vshufps_avx(auVar152,auVar152,0x55);
  auVar100 = vshufps_avx(auVar127,auVar127,0);
  auVar130 = vshufps_avx(auVar127,auVar127,0x55);
  auVar63 = vshufps_avx(auVar221,auVar221,0);
  auVar95 = vshufps_avx(auVar221,auVar221,0x55);
  auVar122 = vshufps_avx(auVar164,auVar164,0);
  auVar94 = vshufps_avx(auVar164,auVar164,0x55);
  auVar69 = ZEXT416((uint)((auVar69._0_4_ - auVar298._0_4_) * 0.04761905));
  auVar69 = vshufps_avx(auVar69,auVar69,0);
  auVar263._0_4_ = auVar202._0_4_ + auVar81._0_4_ * 0.0;
  auVar263._4_4_ = auVar202._4_4_ + auVar81._4_4_ * 0.14285715;
  auVar263._8_4_ = auVar202._8_4_ + auVar81._8_4_ * 0.2857143;
  auVar263._12_4_ = auVar202._12_4_ + auVar81._12_4_ * 0.42857146;
  auVar263._16_4_ = auVar202._0_4_ + auVar81._16_4_ * 0.5714286;
  auVar263._20_4_ = auVar202._4_4_ + auVar81._20_4_ * 0.71428573;
  auVar263._24_4_ = auVar202._8_4_ + auVar81._24_4_ * 0.8571429;
  auVar263._28_4_ = auVar202._12_4_ + auVar81._28_4_;
  auVar13 = vsubps_avx(auVar295,auVar263);
  fVar149 = auVar100._0_4_;
  fVar157 = auVar100._4_4_;
  fVar158 = auVar100._8_4_;
  fVar159 = auVar100._12_4_;
  fVar239 = auVar13._0_4_;
  fVar251 = auVar13._4_4_;
  fVar252 = auVar13._8_4_;
  fVar253 = auVar13._12_4_;
  fVar254 = auVar13._16_4_;
  fVar255 = auVar13._20_4_;
  fVar256 = auVar13._24_4_;
  fVar235 = auVar130._0_4_;
  fVar236 = auVar130._4_4_;
  fVar237 = auVar130._8_4_;
  fVar238 = auVar130._12_4_;
  fVar288 = auVar64._12_4_ + 1.0;
  fVar196 = auVar63._0_4_;
  fVar176 = auVar63._4_4_;
  fVar224 = auVar63._8_4_;
  fVar234 = auVar63._12_4_;
  fVar210 = fVar196 * auVar263._0_4_ + fVar239 * fVar149;
  fVar211 = fVar176 * auVar263._4_4_ + fVar251 * fVar157;
  fVar212 = fVar224 * auVar263._8_4_ + fVar252 * fVar158;
  fVar88 = fVar234 * auVar263._12_4_ + fVar253 * fVar159;
  fVar89 = fVar196 * auVar263._16_4_ + fVar254 * fVar149;
  fVar90 = fVar176 * auVar263._20_4_ + fVar255 * fVar157;
  fVar91 = fVar224 * auVar263._24_4_ + fVar256 * fVar158;
  fVar193 = auVar95._0_4_;
  fVar194 = auVar95._4_4_;
  fVar195 = auVar95._8_4_;
  fVar197 = auVar95._12_4_;
  fVar272 = fVar235 * fVar239 + auVar263._0_4_ * fVar193;
  fVar276 = fVar236 * fVar251 + auVar263._4_4_ * fVar194;
  fVar277 = fVar237 * fVar252 + auVar263._8_4_ * fVar195;
  fVar278 = fVar238 * fVar253 + auVar263._12_4_ * fVar197;
  fVar279 = fVar235 * fVar254 + auVar263._16_4_ * fVar193;
  fVar280 = fVar236 * fVar255 + auVar263._20_4_ * fVar194;
  fVar281 = fVar237 * fVar256 + auVar263._24_4_ * fVar195;
  fVar282 = fVar238 + fVar159;
  auVar202 = vshufps_avx(auVar152,auVar152,0xaa);
  auVar100 = vshufps_avx(auVar152,auVar152,0xff);
  fVar160 = fVar234 + 0.0;
  auVar130 = vshufps_avx(auVar127,auVar127,0xaa);
  auVar63 = vshufps_avx(auVar127,auVar127,0xff);
  auVar174._0_4_ =
       fVar239 * (auVar263._0_4_ * fVar149 + fVar239 * auVar144._0_4_) + auVar263._0_4_ * fVar210;
  auVar174._4_4_ =
       fVar251 * (auVar263._4_4_ * fVar157 + fVar251 * auVar144._4_4_) + auVar263._4_4_ * fVar211;
  auVar174._8_4_ =
       fVar252 * (auVar263._8_4_ * fVar158 + fVar252 * auVar144._8_4_) + auVar263._8_4_ * fVar212;
  auVar174._12_4_ =
       fVar253 * (auVar263._12_4_ * fVar159 + fVar253 * auVar144._12_4_) + auVar263._12_4_ * fVar88;
  auVar174._16_4_ =
       fVar254 * (auVar263._16_4_ * fVar149 + fVar254 * auVar144._0_4_) + auVar263._16_4_ * fVar89;
  auVar174._20_4_ =
       fVar255 * (auVar263._20_4_ * fVar157 + fVar255 * auVar144._4_4_) + auVar263._20_4_ * fVar90;
  auVar174._24_4_ =
       fVar256 * (auVar263._24_4_ * fVar158 + fVar256 * auVar144._8_4_) + auVar263._24_4_ * fVar91;
  auVar174._28_4_ = auVar144._12_4_ + 1.0 + fVar197;
  auVar191._0_4_ =
       fVar239 * (fVar235 * auVar263._0_4_ + auVar64._0_4_ * fVar239) + auVar263._0_4_ * fVar272;
  auVar191._4_4_ =
       fVar251 * (fVar236 * auVar263._4_4_ + auVar64._4_4_ * fVar251) + auVar263._4_4_ * fVar276;
  auVar191._8_4_ =
       fVar252 * (fVar237 * auVar263._8_4_ + auVar64._8_4_ * fVar252) + auVar263._8_4_ * fVar277;
  auVar191._12_4_ =
       fVar253 * (fVar238 * auVar263._12_4_ + auVar64._12_4_ * fVar253) + auVar263._12_4_ * fVar278;
  auVar191._16_4_ =
       fVar254 * (fVar235 * auVar263._16_4_ + auVar64._0_4_ * fVar254) + auVar263._16_4_ * fVar279;
  auVar191._20_4_ =
       fVar255 * (fVar236 * auVar263._20_4_ + auVar64._4_4_ * fVar255) + auVar263._20_4_ * fVar280;
  auVar191._24_4_ =
       fVar256 * (fVar237 * auVar263._24_4_ + auVar64._8_4_ * fVar256) + auVar263._24_4_ * fVar281;
  auVar191._28_4_ = auVar94._12_4_ + fVar197;
  auVar83._0_4_ =
       fVar239 * fVar210 + auVar263._0_4_ * (fVar196 * fVar239 + auVar122._0_4_ * auVar263._0_4_);
  auVar83._4_4_ =
       fVar251 * fVar211 + auVar263._4_4_ * (fVar176 * fVar251 + auVar122._4_4_ * auVar263._4_4_);
  auVar83._8_4_ =
       fVar252 * fVar212 + auVar263._8_4_ * (fVar224 * fVar252 + auVar122._8_4_ * auVar263._8_4_);
  auVar83._12_4_ =
       fVar253 * fVar88 + auVar263._12_4_ * (fVar234 * fVar253 + auVar122._12_4_ * auVar263._12_4_);
  auVar83._16_4_ =
       fVar254 * fVar89 + auVar263._16_4_ * (fVar196 * fVar254 + auVar122._0_4_ * auVar263._16_4_);
  auVar83._20_4_ =
       fVar255 * fVar90 + auVar263._20_4_ * (fVar176 * fVar255 + auVar122._4_4_ * auVar263._20_4_);
  auVar83._24_4_ =
       fVar256 * fVar91 + auVar263._24_4_ * (fVar224 * fVar256 + auVar122._8_4_ * auVar263._24_4_);
  auVar83._28_4_ = fVar159 + 1.0 + fVar160;
  auVar271._0_4_ =
       fVar239 * fVar272 + auVar263._0_4_ * (auVar94._0_4_ * auVar263._0_4_ + fVar239 * fVar193);
  auVar271._4_4_ =
       fVar251 * fVar276 + auVar263._4_4_ * (auVar94._4_4_ * auVar263._4_4_ + fVar251 * fVar194);
  auVar271._8_4_ =
       fVar252 * fVar277 + auVar263._8_4_ * (auVar94._8_4_ * auVar263._8_4_ + fVar252 * fVar195);
  auVar271._12_4_ =
       fVar253 * fVar278 + auVar263._12_4_ * (auVar94._12_4_ * auVar263._12_4_ + fVar253 * fVar197);
  auVar271._16_4_ =
       fVar254 * fVar279 + auVar263._16_4_ * (auVar94._0_4_ * auVar263._16_4_ + fVar254 * fVar193);
  auVar271._20_4_ =
       fVar255 * fVar280 + auVar263._20_4_ * (auVar94._4_4_ * auVar263._20_4_ + fVar255 * fVar194);
  auVar271._24_4_ =
       fVar256 * fVar281 + auVar263._24_4_ * (auVar94._8_4_ * auVar263._24_4_ + fVar256 * fVar195);
  auVar271._28_4_ = fVar160 + fVar197 + 0.0;
  local_220._0_4_ = fVar239 * auVar174._0_4_ + auVar263._0_4_ * auVar83._0_4_;
  local_220._4_4_ = fVar251 * auVar174._4_4_ + auVar263._4_4_ * auVar83._4_4_;
  local_220._8_4_ = fVar252 * auVar174._8_4_ + auVar263._8_4_ * auVar83._8_4_;
  local_220._12_4_ = fVar253 * auVar174._12_4_ + auVar263._12_4_ * auVar83._12_4_;
  local_220._16_4_ = fVar254 * auVar174._16_4_ + auVar263._16_4_ * auVar83._16_4_;
  local_220._20_4_ = fVar255 * auVar174._20_4_ + auVar263._20_4_ * auVar83._20_4_;
  local_220._24_4_ = fVar256 * auVar174._24_4_ + auVar263._24_4_ * auVar83._24_4_;
  local_220._28_4_ = fVar282 + fVar197 + 0.0;
  auVar156._0_4_ = fVar239 * auVar191._0_4_ + auVar263._0_4_ * auVar271._0_4_;
  auVar156._4_4_ = fVar251 * auVar191._4_4_ + auVar263._4_4_ * auVar271._4_4_;
  auVar156._8_4_ = fVar252 * auVar191._8_4_ + auVar263._8_4_ * auVar271._8_4_;
  auVar156._12_4_ = fVar253 * auVar191._12_4_ + auVar263._12_4_ * auVar271._12_4_;
  auVar156._16_4_ = fVar254 * auVar191._16_4_ + auVar263._16_4_ * auVar271._16_4_;
  auVar156._20_4_ = fVar255 * auVar191._20_4_ + auVar263._20_4_ * auVar271._20_4_;
  auVar156._24_4_ = fVar256 * auVar191._24_4_ + auVar263._24_4_ * auVar271._24_4_;
  auVar156._28_4_ = fVar282 + fVar160;
  auVar14 = vsubps_avx(auVar83,auVar174);
  auVar81 = vsubps_avx(auVar271,auVar191);
  local_640 = auVar69._0_4_;
  fStack_63c = auVar69._4_4_;
  fStack_638 = auVar69._8_4_;
  fStack_634 = auVar69._12_4_;
  local_260 = local_640 * auVar14._0_4_ * 3.0;
  fStack_25c = fStack_63c * auVar14._4_4_ * 3.0;
  auVar15._4_4_ = fStack_25c;
  auVar15._0_4_ = local_260;
  fStack_258 = fStack_638 * auVar14._8_4_ * 3.0;
  auVar15._8_4_ = fStack_258;
  fStack_254 = fStack_634 * auVar14._12_4_ * 3.0;
  auVar15._12_4_ = fStack_254;
  fStack_250 = local_640 * auVar14._16_4_ * 3.0;
  auVar15._16_4_ = fStack_250;
  fStack_24c = fStack_63c * auVar14._20_4_ * 3.0;
  auVar15._20_4_ = fStack_24c;
  fStack_248 = fStack_638 * auVar14._24_4_ * 3.0;
  auVar15._24_4_ = fStack_248;
  auVar15._28_4_ = auVar14._28_4_;
  local_280 = local_640 * auVar81._0_4_ * 3.0;
  fStack_27c = fStack_63c * auVar81._4_4_ * 3.0;
  auVar16._4_4_ = fStack_27c;
  auVar16._0_4_ = local_280;
  fStack_278 = fStack_638 * auVar81._8_4_ * 3.0;
  auVar16._8_4_ = fStack_278;
  fStack_274 = fStack_634 * auVar81._12_4_ * 3.0;
  auVar16._12_4_ = fStack_274;
  fStack_270 = local_640 * auVar81._16_4_ * 3.0;
  auVar16._16_4_ = fStack_270;
  fStack_26c = fStack_63c * auVar81._20_4_ * 3.0;
  auVar16._20_4_ = fStack_26c;
  fStack_268 = fStack_638 * auVar81._24_4_ * 3.0;
  auVar16._24_4_ = fStack_268;
  auVar16._28_4_ = fVar282;
  auVar15 = vsubps_avx(local_220,auVar15);
  auVar81 = vperm2f128_avx(auVar15,auVar15,1);
  auVar81 = vshufps_avx(auVar81,auVar15,0x30);
  auVar81 = vshufps_avx(auVar15,auVar81,0x29);
  auVar16 = vsubps_avx(auVar156,auVar16);
  auVar15 = vperm2f128_avx(auVar16,auVar16,1);
  auVar15 = vshufps_avx(auVar15,auVar16,0x30);
  auVar16 = vshufps_avx(auVar16,auVar15,0x29);
  fVar280 = auVar130._0_4_;
  fVar281 = auVar130._4_4_;
  fVar299 = auVar130._8_4_;
  fVar159 = auVar202._12_4_;
  fVar176 = auVar63._0_4_;
  fVar234 = auVar63._4_4_;
  fVar272 = auVar63._8_4_;
  fVar276 = auVar63._12_4_;
  auVar69 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar149 = auVar69._0_4_;
  fVar157 = auVar69._4_4_;
  fVar158 = auVar69._8_4_;
  fVar197 = auVar69._12_4_;
  fVar212 = auVar263._0_4_ * fVar149 + fVar280 * fVar239;
  fVar88 = auVar263._4_4_ * fVar157 + fVar281 * fVar251;
  fVar89 = auVar263._8_4_ * fVar158 + fVar299 * fVar252;
  fVar90 = auVar263._12_4_ * fVar197 + auVar130._12_4_ * fVar253;
  fVar91 = auVar263._16_4_ * fVar149 + fVar280 * fVar254;
  fVar160 = auVar263._20_4_ * fVar157 + fVar281 * fVar255;
  fVar196 = auVar263._24_4_ * fVar158 + fVar299 * fVar256;
  auVar69 = vshufps_avx(auVar221,auVar221,0xff);
  fVar193 = auVar69._0_4_;
  fVar194 = auVar69._4_4_;
  fVar195 = auVar69._8_4_;
  fVar210 = auVar69._12_4_;
  fVar224 = auVar263._0_4_ * fVar193 + fVar176 * fVar239;
  fVar235 = auVar263._4_4_ * fVar194 + fVar234 * fVar251;
  fVar236 = auVar263._8_4_ * fVar195 + fVar272 * fVar252;
  fVar237 = auVar263._12_4_ * fVar210 + fVar276 * fVar253;
  fVar277 = auVar263._16_4_ * fVar193 + fVar176 * fVar254;
  fVar238 = auVar263._20_4_ * fVar194 + fVar234 * fVar255;
  fVar278 = auVar263._24_4_ * fVar195 + fVar272 * fVar256;
  auVar69 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar279 = auVar69._12_4_ + fVar197;
  auVar144 = vshufps_avx(auVar164,auVar164,0xff);
  fVar211 = auVar144._12_4_;
  auVar84._0_4_ =
       fVar239 * (fVar280 * auVar263._0_4_ + fVar239 * auVar202._0_4_) + auVar263._0_4_ * fVar212;
  auVar84._4_4_ =
       fVar251 * (fVar281 * auVar263._4_4_ + fVar251 * auVar202._4_4_) + auVar263._4_4_ * fVar88;
  auVar84._8_4_ =
       fVar252 * (fVar299 * auVar263._8_4_ + fVar252 * auVar202._8_4_) + auVar263._8_4_ * fVar89;
  auVar84._12_4_ =
       fVar253 * (auVar130._12_4_ * auVar263._12_4_ + fVar253 * fVar159) + auVar263._12_4_ * fVar90;
  auVar84._16_4_ =
       fVar254 * (fVar280 * auVar263._16_4_ + fVar254 * auVar202._0_4_) + auVar263._16_4_ * fVar91;
  auVar84._20_4_ =
       fVar255 * (fVar281 * auVar263._20_4_ + fVar255 * auVar202._4_4_) + auVar263._20_4_ * fVar160;
  auVar84._24_4_ =
       fVar256 * (fVar299 * auVar263._24_4_ + fVar256 * auVar202._8_4_) + auVar263._24_4_ * fVar196;
  auVar84._28_4_ = auVar16._28_4_ + fVar159 + fVar211;
  auVar115._0_4_ =
       fVar239 * (fVar176 * auVar263._0_4_ + auVar100._0_4_ * fVar239) + auVar263._0_4_ * fVar224;
  auVar115._4_4_ =
       fVar251 * (fVar234 * auVar263._4_4_ + auVar100._4_4_ * fVar251) + auVar263._4_4_ * fVar235;
  auVar115._8_4_ =
       fVar252 * (fVar272 * auVar263._8_4_ + auVar100._8_4_ * fVar252) + auVar263._8_4_ * fVar236;
  auVar115._12_4_ =
       fVar253 * (fVar276 * auVar263._12_4_ + auVar100._12_4_ * fVar253) + auVar263._12_4_ * fVar237
  ;
  auVar115._16_4_ =
       fVar254 * (fVar176 * auVar263._16_4_ + auVar100._0_4_ * fVar254) + auVar263._16_4_ * fVar277;
  auVar115._20_4_ =
       fVar255 * (fVar234 * auVar263._20_4_ + auVar100._4_4_ * fVar255) + auVar263._20_4_ * fVar238;
  auVar115._24_4_ =
       fVar256 * (fVar272 * auVar263._24_4_ + auVar100._8_4_ * fVar256) + auVar263._24_4_ * fVar278;
  auVar115._28_4_ = fVar159 + auVar15._28_4_ + fVar211;
  auVar15 = vperm2f128_avx(local_220,local_220,1);
  auVar15 = vshufps_avx(auVar15,local_220,0x30);
  _local_560 = vshufps_avx(local_220,auVar15,0x29);
  auVar192._0_4_ =
       auVar263._0_4_ * (auVar69._0_4_ * auVar263._0_4_ + fVar239 * fVar149) + fVar239 * fVar212;
  auVar192._4_4_ =
       auVar263._4_4_ * (auVar69._4_4_ * auVar263._4_4_ + fVar251 * fVar157) + fVar251 * fVar88;
  auVar192._8_4_ =
       auVar263._8_4_ * (auVar69._8_4_ * auVar263._8_4_ + fVar252 * fVar158) + fVar252 * fVar89;
  auVar192._12_4_ =
       auVar263._12_4_ * (auVar69._12_4_ * auVar263._12_4_ + fVar253 * fVar197) + fVar253 * fVar90;
  auVar192._16_4_ =
       auVar263._16_4_ * (auVar69._0_4_ * auVar263._16_4_ + fVar254 * fVar149) + fVar254 * fVar91;
  auVar192._20_4_ =
       auVar263._20_4_ * (auVar69._4_4_ * auVar263._20_4_ + fVar255 * fVar157) + fVar255 * fVar160;
  auVar192._24_4_ =
       auVar263._24_4_ * (auVar69._8_4_ * auVar263._24_4_ + fVar256 * fVar158) + fVar256 * fVar196;
  auVar192._28_4_ = fVar279 + fVar288 + auVar191._28_4_;
  auVar233._0_4_ =
       fVar239 * fVar224 + auVar263._0_4_ * (auVar263._0_4_ * auVar144._0_4_ + fVar239 * fVar193);
  auVar233._4_4_ =
       fVar251 * fVar235 + auVar263._4_4_ * (auVar263._4_4_ * auVar144._4_4_ + fVar251 * fVar194);
  auVar233._8_4_ =
       fVar252 * fVar236 + auVar263._8_4_ * (auVar263._8_4_ * auVar144._8_4_ + fVar252 * fVar195);
  auVar233._12_4_ =
       fVar253 * fVar237 + auVar263._12_4_ * (auVar263._12_4_ * fVar211 + fVar253 * fVar210);
  auVar233._16_4_ =
       fVar254 * fVar277 + auVar263._16_4_ * (auVar263._16_4_ * auVar144._0_4_ + fVar254 * fVar193);
  auVar233._20_4_ =
       fVar255 * fVar238 + auVar263._20_4_ * (auVar263._20_4_ * auVar144._4_4_ + fVar255 * fVar194);
  auVar233._24_4_ =
       fVar256 * fVar278 + auVar263._24_4_ * (auVar263._24_4_ * auVar144._8_4_ + fVar256 * fVar195);
  auVar233._28_4_ = fVar288 + fVar276 + fVar211 + fVar210;
  auVar223._0_4_ = fVar239 * auVar84._0_4_ + auVar263._0_4_ * auVar192._0_4_;
  auVar223._4_4_ = fVar251 * auVar84._4_4_ + auVar263._4_4_ * auVar192._4_4_;
  auVar223._8_4_ = fVar252 * auVar84._8_4_ + auVar263._8_4_ * auVar192._8_4_;
  auVar223._12_4_ = fVar253 * auVar84._12_4_ + auVar263._12_4_ * auVar192._12_4_;
  auVar223._16_4_ = fVar254 * auVar84._16_4_ + auVar263._16_4_ * auVar192._16_4_;
  auVar223._20_4_ = fVar255 * auVar84._20_4_ + auVar263._20_4_ * auVar192._20_4_;
  auVar223._24_4_ = fVar256 * auVar84._24_4_ + auVar263._24_4_ * auVar192._24_4_;
  auVar223._28_4_ = fVar279 + fVar211 + fVar210;
  auVar250._0_4_ = fVar239 * auVar115._0_4_ + auVar263._0_4_ * auVar233._0_4_;
  auVar250._4_4_ = fVar251 * auVar115._4_4_ + auVar263._4_4_ * auVar233._4_4_;
  auVar250._8_4_ = fVar252 * auVar115._8_4_ + auVar263._8_4_ * auVar233._8_4_;
  auVar250._12_4_ = fVar253 * auVar115._12_4_ + auVar263._12_4_ * auVar233._12_4_;
  auVar250._16_4_ = fVar254 * auVar115._16_4_ + auVar263._16_4_ * auVar233._16_4_;
  auVar250._20_4_ = fVar255 * auVar115._20_4_ + auVar263._20_4_ * auVar233._20_4_;
  auVar250._24_4_ = fVar256 * auVar115._24_4_ + auVar263._24_4_ * auVar233._24_4_;
  auVar250._28_4_ = auVar13._28_4_ + auVar263._28_4_;
  auVar17 = vsubps_avx(auVar192,auVar84);
  auVar15 = vsubps_avx(auVar233,auVar115);
  local_2a0 = local_640 * auVar17._0_4_ * 3.0;
  fStack_29c = fStack_63c * auVar17._4_4_ * 3.0;
  auVar13._4_4_ = fStack_29c;
  auVar13._0_4_ = local_2a0;
  fStack_298 = fStack_638 * auVar17._8_4_ * 3.0;
  auVar13._8_4_ = fStack_298;
  fStack_294 = fStack_634 * auVar17._12_4_ * 3.0;
  auVar13._12_4_ = fStack_294;
  fStack_290 = local_640 * auVar17._16_4_ * 3.0;
  auVar13._16_4_ = fStack_290;
  fStack_28c = fStack_63c * auVar17._20_4_ * 3.0;
  auVar13._20_4_ = fStack_28c;
  fStack_288 = fStack_638 * auVar17._24_4_ * 3.0;
  auVar13._24_4_ = fStack_288;
  auVar13._28_4_ = auVar17._28_4_;
  local_2c0 = local_640 * auVar15._0_4_ * 3.0;
  fStack_2bc = fStack_63c * auVar15._4_4_ * 3.0;
  auVar18._4_4_ = fStack_2bc;
  auVar18._0_4_ = local_2c0;
  fStack_2b8 = fStack_638 * auVar15._8_4_ * 3.0;
  auVar18._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_634 * auVar15._12_4_ * 3.0;
  auVar18._12_4_ = fStack_2b4;
  fStack_2b0 = local_640 * auVar15._16_4_ * 3.0;
  auVar18._16_4_ = fStack_2b0;
  fStack_2ac = fStack_63c * auVar15._20_4_ * 3.0;
  auVar18._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_638 * auVar15._24_4_ * 3.0;
  auVar18._24_4_ = fStack_2a8;
  auVar18._28_4_ = auVar192._28_4_;
  auVar15 = vperm2f128_avx(auVar223,auVar223,1);
  auVar15 = vshufps_avx(auVar15,auVar223,0x30);
  auVar82 = vshufps_avx(auVar223,auVar15,0x29);
  auVar13 = vsubps_avx(auVar223,auVar13);
  auVar15 = vperm2f128_avx(auVar13,auVar13,1);
  auVar15 = vshufps_avx(auVar15,auVar13,0x30);
  auVar15 = vshufps_avx(auVar13,auVar15,0x29);
  auVar18 = vsubps_avx(auVar250,auVar18);
  auVar13 = vperm2f128_avx(auVar18,auVar18,1);
  auVar13 = vshufps_avx(auVar13,auVar18,0x30);
  local_200 = vshufps_avx(auVar18,auVar13,0x29);
  auVar19 = vsubps_avx(auVar223,local_220);
  auVar83 = vsubps_avx(auVar82,_local_560);
  fVar149 = auVar83._0_4_ + auVar19._0_4_;
  fVar193 = auVar83._4_4_ + auVar19._4_4_;
  fVar157 = auVar83._8_4_ + auVar19._8_4_;
  fVar194 = auVar83._12_4_ + auVar19._12_4_;
  fVar158 = auVar83._16_4_ + auVar19._16_4_;
  fVar195 = auVar83._20_4_ + auVar19._20_4_;
  fVar159 = auVar83._24_4_ + auVar19._24_4_;
  auVar13 = vperm2f128_avx(auVar156,auVar156,1);
  auVar13 = vshufps_avx(auVar13,auVar156,0x30);
  local_240 = vshufps_avx(auVar156,auVar13,0x29);
  auVar13 = vperm2f128_avx(auVar250,auVar250,1);
  auVar13 = vshufps_avx(auVar13,auVar250,0x30);
  auVar18 = vshufps_avx(auVar250,auVar13,0x29);
  auVar13 = vsubps_avx(auVar250,auVar156);
  auVar84 = vsubps_avx(auVar18,local_240);
  fVar197 = auVar84._0_4_ + auVar13._0_4_;
  fVar210 = auVar84._4_4_ + auVar13._4_4_;
  fVar211 = auVar84._8_4_ + auVar13._8_4_;
  fVar212 = auVar84._12_4_ + auVar13._12_4_;
  fVar88 = auVar84._16_4_ + auVar13._16_4_;
  fVar89 = auVar84._20_4_ + auVar13._20_4_;
  fVar90 = auVar84._24_4_ + auVar13._24_4_;
  auVar20._4_4_ = fVar193 * auVar156._4_4_;
  auVar20._0_4_ = fVar149 * auVar156._0_4_;
  auVar20._8_4_ = fVar157 * auVar156._8_4_;
  auVar20._12_4_ = fVar194 * auVar156._12_4_;
  auVar20._16_4_ = fVar158 * auVar156._16_4_;
  auVar20._20_4_ = fVar195 * auVar156._20_4_;
  auVar20._24_4_ = fVar159 * auVar156._24_4_;
  auVar20._28_4_ = auVar13._28_4_;
  auVar21._4_4_ = fVar210 * local_220._4_4_;
  auVar21._0_4_ = fVar197 * local_220._0_4_;
  auVar21._8_4_ = fVar211 * local_220._8_4_;
  auVar21._12_4_ = fVar212 * local_220._12_4_;
  auVar21._16_4_ = fVar88 * local_220._16_4_;
  auVar21._20_4_ = fVar89 * local_220._20_4_;
  auVar21._24_4_ = fVar90 * local_220._24_4_;
  auVar21._28_4_ = fVar279;
  auVar20 = vsubps_avx(auVar20,auVar21);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar14._28_4_;
  local_280 = local_280 + auVar156._0_4_;
  fStack_27c = fStack_27c + auVar156._4_4_;
  fStack_278 = fStack_278 + auVar156._8_4_;
  fStack_274 = fStack_274 + auVar156._12_4_;
  fStack_270 = fStack_270 + auVar156._16_4_;
  fStack_26c = fStack_26c + auVar156._20_4_;
  fStack_268 = fStack_268 + auVar156._24_4_;
  fStack_264 = fVar282 + auVar156._28_4_;
  auVar14._4_4_ = fVar193 * fStack_27c;
  auVar14._0_4_ = fVar149 * local_280;
  auVar14._8_4_ = fVar157 * fStack_278;
  auVar14._12_4_ = fVar194 * fStack_274;
  auVar14._16_4_ = fVar158 * fStack_270;
  auVar14._20_4_ = fVar195 * fStack_26c;
  auVar14._24_4_ = fVar159 * fStack_268;
  auVar14._28_4_ = fVar282;
  auVar22._4_4_ = fVar210 * fStack_25c;
  auVar22._0_4_ = fVar197 * local_260;
  auVar22._8_4_ = fVar211 * fStack_258;
  auVar22._12_4_ = fVar212 * fStack_254;
  auVar22._16_4_ = fVar88 * fStack_250;
  auVar22._20_4_ = fVar89 * fStack_24c;
  auVar22._24_4_ = fVar90 * fStack_248;
  auVar22._28_4_ = fVar282 + auVar156._28_4_;
  auVar14 = vsubps_avx(auVar14,auVar22);
  local_6c0._0_4_ = auVar16._0_4_;
  local_6c0._4_4_ = auVar16._4_4_;
  fStack_6b8 = auVar16._8_4_;
  fStack_6b4 = auVar16._12_4_;
  fStack_6b0 = auVar16._16_4_;
  fStack_6ac = auVar16._20_4_;
  fStack_6a8 = auVar16._24_4_;
  auVar23._4_4_ = fVar193 * (float)local_6c0._4_4_;
  auVar23._0_4_ = fVar149 * (float)local_6c0._0_4_;
  auVar23._8_4_ = fVar157 * fStack_6b8;
  auVar23._12_4_ = fVar194 * fStack_6b4;
  auVar23._16_4_ = fVar158 * fStack_6b0;
  auVar23._20_4_ = fVar195 * fStack_6ac;
  auVar23._24_4_ = fVar159 * fStack_6a8;
  auVar23._28_4_ = fVar282;
  local_720._0_4_ = auVar81._0_4_;
  local_720._4_4_ = auVar81._4_4_;
  fStack_718 = auVar81._8_4_;
  fStack_714 = auVar81._12_4_;
  fStack_710 = auVar81._16_4_;
  fStack_70c = auVar81._20_4_;
  fStack_708 = auVar81._24_4_;
  auVar24._4_4_ = fVar210 * (float)local_720._4_4_;
  auVar24._0_4_ = fVar197 * (float)local_720._0_4_;
  auVar24._8_4_ = fVar211 * fStack_718;
  auVar24._12_4_ = fVar212 * fStack_714;
  auVar24._16_4_ = fVar88 * fStack_710;
  auVar24._20_4_ = fVar89 * fStack_70c;
  auVar24._24_4_ = fVar90 * fStack_708;
  auVar24._28_4_ = local_220._28_4_;
  auVar21 = vsubps_avx(auVar23,auVar24);
  auVar25._4_4_ = local_240._4_4_ * fVar193;
  auVar25._0_4_ = local_240._0_4_ * fVar149;
  auVar25._8_4_ = local_240._8_4_ * fVar157;
  auVar25._12_4_ = local_240._12_4_ * fVar194;
  auVar25._16_4_ = local_240._16_4_ * fVar158;
  auVar25._20_4_ = local_240._20_4_ * fVar195;
  auVar25._24_4_ = local_240._24_4_ * fVar159;
  auVar25._28_4_ = fVar282;
  auVar26._4_4_ = local_560._4_4_ * fVar210;
  auVar26._0_4_ = local_560._0_4_ * fVar197;
  auVar26._8_4_ = local_560._8_4_ * fVar211;
  auVar26._12_4_ = local_560._12_4_ * fVar212;
  auVar26._16_4_ = local_560._16_4_ * fVar88;
  auVar26._20_4_ = local_560._20_4_ * fVar89;
  auVar26._24_4_ = local_560._24_4_ * fVar90;
  auVar26._28_4_ = local_240._28_4_;
  local_640 = auVar15._0_4_;
  fStack_63c = auVar15._4_4_;
  fStack_638 = auVar15._8_4_;
  fStack_634 = auVar15._12_4_;
  fStack_630 = auVar15._16_4_;
  fStack_62c = auVar15._20_4_;
  fStack_628 = auVar15._24_4_;
  auVar22 = vsubps_avx(auVar25,auVar26);
  auVar27._4_4_ = auVar250._4_4_ * fVar193;
  auVar27._0_4_ = auVar250._0_4_ * fVar149;
  auVar27._8_4_ = auVar250._8_4_ * fVar157;
  auVar27._12_4_ = auVar250._12_4_ * fVar194;
  auVar27._16_4_ = auVar250._16_4_ * fVar158;
  auVar27._20_4_ = auVar250._20_4_ * fVar195;
  auVar27._24_4_ = auVar250._24_4_ * fVar159;
  auVar27._28_4_ = fVar282;
  auVar28._4_4_ = fVar210 * auVar223._4_4_;
  auVar28._0_4_ = fVar197 * auVar223._0_4_;
  auVar28._8_4_ = fVar211 * auVar223._8_4_;
  auVar28._12_4_ = fVar212 * auVar223._12_4_;
  auVar28._16_4_ = fVar88 * auVar223._16_4_;
  auVar28._20_4_ = fVar89 * auVar223._20_4_;
  auVar28._24_4_ = fVar90 * auVar223._24_4_;
  auVar28._28_4_ = fStack_244;
  auVar23 = vsubps_avx(auVar27,auVar28);
  local_2a0 = auVar223._0_4_ + local_2a0;
  fStack_29c = auVar223._4_4_ + fStack_29c;
  fStack_298 = auVar223._8_4_ + fStack_298;
  fStack_294 = auVar223._12_4_ + fStack_294;
  fStack_290 = auVar223._16_4_ + fStack_290;
  fStack_28c = auVar223._20_4_ + fStack_28c;
  fStack_288 = auVar223._24_4_ + fStack_288;
  fStack_284 = auVar223._28_4_ + auVar17._28_4_;
  local_2c0 = auVar250._0_4_ + local_2c0;
  fStack_2bc = auVar250._4_4_ + fStack_2bc;
  fStack_2b8 = auVar250._8_4_ + fStack_2b8;
  fStack_2b4 = auVar250._12_4_ + fStack_2b4;
  fStack_2b0 = auVar250._16_4_ + fStack_2b0;
  fStack_2ac = auVar250._20_4_ + fStack_2ac;
  fStack_2a8 = auVar250._24_4_ + fStack_2a8;
  fStack_2a4 = auVar250._28_4_ + auVar192._28_4_;
  auVar17._4_4_ = fVar193 * fStack_2bc;
  auVar17._0_4_ = fVar149 * local_2c0;
  auVar17._8_4_ = fVar157 * fStack_2b8;
  auVar17._12_4_ = fVar194 * fStack_2b4;
  auVar17._16_4_ = fVar158 * fStack_2b0;
  auVar17._20_4_ = fVar195 * fStack_2ac;
  auVar17._24_4_ = fVar159 * fStack_2a8;
  auVar17._28_4_ = auVar250._28_4_ + auVar192._28_4_;
  auVar29._4_4_ = fStack_29c * fVar210;
  auVar29._0_4_ = local_2a0 * fVar197;
  auVar29._8_4_ = fStack_298 * fVar211;
  auVar29._12_4_ = fStack_294 * fVar212;
  auVar29._16_4_ = fStack_290 * fVar88;
  auVar29._20_4_ = fStack_28c * fVar89;
  auVar29._24_4_ = fStack_288 * fVar90;
  auVar29._28_4_ = fStack_284;
  auVar17 = vsubps_avx(auVar17,auVar29);
  auVar30._4_4_ = fVar193 * local_200._4_4_;
  auVar30._0_4_ = fVar149 * local_200._0_4_;
  auVar30._8_4_ = fVar157 * local_200._8_4_;
  auVar30._12_4_ = fVar194 * local_200._12_4_;
  auVar30._16_4_ = fVar158 * local_200._16_4_;
  auVar30._20_4_ = fVar195 * local_200._20_4_;
  auVar30._24_4_ = fVar159 * local_200._24_4_;
  auVar30._28_4_ = fStack_284;
  auVar31._4_4_ = fVar210 * fStack_63c;
  auVar31._0_4_ = fVar197 * local_640;
  auVar31._8_4_ = fVar211 * fStack_638;
  auVar31._12_4_ = fVar212 * fStack_634;
  auVar31._16_4_ = fVar88 * fStack_630;
  auVar31._20_4_ = fVar89 * fStack_62c;
  auVar31._24_4_ = fVar90 * fStack_628;
  auVar31._28_4_ = local_200._28_4_;
  auVar24 = vsubps_avx(auVar30,auVar31);
  auVar32._4_4_ = fVar193 * auVar18._4_4_;
  auVar32._0_4_ = fVar149 * auVar18._0_4_;
  auVar32._8_4_ = fVar157 * auVar18._8_4_;
  auVar32._12_4_ = fVar194 * auVar18._12_4_;
  auVar32._16_4_ = fVar158 * auVar18._16_4_;
  auVar32._20_4_ = fVar195 * auVar18._20_4_;
  auVar32._24_4_ = fVar159 * auVar18._24_4_;
  auVar32._28_4_ = auVar83._28_4_ + auVar19._28_4_;
  auVar19._4_4_ = auVar82._4_4_ * fVar210;
  auVar19._0_4_ = auVar82._0_4_ * fVar197;
  auVar19._8_4_ = auVar82._8_4_ * fVar211;
  auVar19._12_4_ = auVar82._12_4_ * fVar212;
  auVar19._16_4_ = auVar82._16_4_ * fVar88;
  auVar19._20_4_ = auVar82._20_4_ * fVar89;
  auVar19._24_4_ = auVar82._24_4_ * fVar90;
  auVar19._28_4_ = auVar84._28_4_ + auVar13._28_4_;
  auVar19 = vsubps_avx(auVar32,auVar19);
  auVar15 = vminps_avx(auVar20,auVar14);
  auVar81 = vmaxps_avx(auVar20,auVar14);
  auVar16 = vminps_avx(auVar21,auVar22);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar21,auVar22);
  auVar81 = vmaxps_avx(auVar81,auVar15);
  auVar13 = vminps_avx(auVar23,auVar17);
  auVar15 = vmaxps_avx(auVar23,auVar17);
  auVar14 = vminps_avx(auVar24,auVar19);
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar14 = vminps_avx(auVar16,auVar14);
  auVar16 = vmaxps_avx(auVar24,auVar19);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar81,auVar15);
  auVar81 = vcmpps_avx(auVar14,local_1c0,2);
  auVar15 = vcmpps_avx(auVar15,local_1e0,5);
  auVar81 = vandps_avx(auVar15,auVar81);
  auVar15 = local_2e0 & auVar81;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(_local_560,local_220);
    auVar16 = vsubps_avx(auVar82,auVar223);
    fVar193 = auVar15._0_4_ + auVar16._0_4_;
    fVar157 = auVar15._4_4_ + auVar16._4_4_;
    fVar194 = auVar15._8_4_ + auVar16._8_4_;
    fVar158 = auVar15._12_4_ + auVar16._12_4_;
    fVar195 = auVar15._16_4_ + auVar16._16_4_;
    fVar159 = auVar15._20_4_ + auVar16._20_4_;
    fVar197 = auVar15._24_4_ + auVar16._24_4_;
    auVar14 = vsubps_avx(local_240,auVar156);
    auVar17 = vsubps_avx(auVar18,auVar250);
    fVar210 = auVar14._0_4_ + auVar17._0_4_;
    fVar211 = auVar14._4_4_ + auVar17._4_4_;
    fVar212 = auVar14._8_4_ + auVar17._8_4_;
    fVar88 = auVar14._12_4_ + auVar17._12_4_;
    fVar89 = auVar14._16_4_ + auVar17._16_4_;
    fVar90 = auVar14._20_4_ + auVar17._20_4_;
    fVar91 = auVar14._24_4_ + auVar17._24_4_;
    fVar149 = auVar17._28_4_;
    auVar33._4_4_ = auVar156._4_4_ * fVar157;
    auVar33._0_4_ = auVar156._0_4_ * fVar193;
    auVar33._8_4_ = auVar156._8_4_ * fVar194;
    auVar33._12_4_ = auVar156._12_4_ * fVar158;
    auVar33._16_4_ = auVar156._16_4_ * fVar195;
    auVar33._20_4_ = auVar156._20_4_ * fVar159;
    auVar33._24_4_ = auVar156._24_4_ * fVar197;
    auVar33._28_4_ = auVar156._28_4_;
    auVar34._4_4_ = local_220._4_4_ * fVar211;
    auVar34._0_4_ = local_220._0_4_ * fVar210;
    auVar34._8_4_ = local_220._8_4_ * fVar212;
    auVar34._12_4_ = local_220._12_4_ * fVar88;
    auVar34._16_4_ = local_220._16_4_ * fVar89;
    auVar34._20_4_ = local_220._20_4_ * fVar90;
    auVar34._24_4_ = local_220._24_4_ * fVar91;
    auVar34._28_4_ = local_220._28_4_;
    auVar17 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar157 * fStack_27c;
    auVar35._0_4_ = fVar193 * local_280;
    auVar35._8_4_ = fVar194 * fStack_278;
    auVar35._12_4_ = fVar158 * fStack_274;
    auVar35._16_4_ = fVar195 * fStack_270;
    auVar35._20_4_ = fVar159 * fStack_26c;
    auVar35._24_4_ = fVar197 * fStack_268;
    auVar35._28_4_ = auVar156._28_4_;
    auVar36._4_4_ = fVar211 * fStack_25c;
    auVar36._0_4_ = fVar210 * local_260;
    auVar36._8_4_ = fVar212 * fStack_258;
    auVar36._12_4_ = fVar88 * fStack_254;
    auVar36._16_4_ = fVar89 * fStack_250;
    auVar36._20_4_ = fVar90 * fStack_24c;
    auVar36._24_4_ = fVar91 * fStack_248;
    auVar36._28_4_ = fVar149;
    auVar19 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar157 * (float)local_6c0._4_4_;
    auVar37._0_4_ = fVar193 * (float)local_6c0._0_4_;
    auVar37._8_4_ = fVar194 * fStack_6b8;
    auVar37._12_4_ = fVar158 * fStack_6b4;
    auVar37._16_4_ = fVar195 * fStack_6b0;
    auVar37._20_4_ = fVar159 * fStack_6ac;
    auVar37._24_4_ = fVar197 * fStack_6a8;
    auVar37._28_4_ = fVar149;
    auVar38._4_4_ = fVar211 * (float)local_720._4_4_;
    auVar38._0_4_ = fVar210 * (float)local_720._0_4_;
    auVar38._8_4_ = fVar212 * fStack_718;
    auVar38._12_4_ = fVar88 * fStack_714;
    auVar38._16_4_ = fVar89 * fStack_710;
    auVar38._20_4_ = fVar90 * fStack_70c;
    auVar38._24_4_ = fVar91 * fStack_708;
    auVar38._28_4_ = auVar13._28_4_;
    auVar83 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = local_240._4_4_ * fVar157;
    auVar39._0_4_ = local_240._0_4_ * fVar193;
    auVar39._8_4_ = local_240._8_4_ * fVar194;
    auVar39._12_4_ = local_240._12_4_ * fVar158;
    auVar39._16_4_ = local_240._16_4_ * fVar195;
    auVar39._20_4_ = local_240._20_4_ * fVar159;
    auVar39._24_4_ = local_240._24_4_ * fVar197;
    auVar39._28_4_ = auVar13._28_4_;
    auVar40._4_4_ = local_560._4_4_ * fVar211;
    auVar40._0_4_ = local_560._0_4_ * fVar210;
    auVar40._8_4_ = local_560._8_4_ * fVar212;
    auVar40._12_4_ = local_560._12_4_ * fVar88;
    auVar40._16_4_ = local_560._16_4_ * fVar89;
    auVar40._20_4_ = local_560._20_4_ * fVar90;
    uVar60 = local_560._28_4_;
    auVar40._24_4_ = local_560._24_4_ * fVar91;
    auVar40._28_4_ = uVar60;
    auVar84 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar250._4_4_ * fVar157;
    auVar41._0_4_ = auVar250._0_4_ * fVar193;
    auVar41._8_4_ = auVar250._8_4_ * fVar194;
    auVar41._12_4_ = auVar250._12_4_ * fVar158;
    auVar41._16_4_ = auVar250._16_4_ * fVar195;
    auVar41._20_4_ = auVar250._20_4_ * fVar159;
    auVar41._24_4_ = auVar250._24_4_ * fVar197;
    auVar41._28_4_ = uVar60;
    auVar42._4_4_ = auVar223._4_4_ * fVar211;
    auVar42._0_4_ = auVar223._0_4_ * fVar210;
    auVar42._8_4_ = auVar223._8_4_ * fVar212;
    auVar42._12_4_ = auVar223._12_4_ * fVar88;
    auVar42._16_4_ = auVar223._16_4_ * fVar89;
    auVar42._20_4_ = auVar223._20_4_ * fVar90;
    auVar42._24_4_ = auVar223._24_4_ * fVar91;
    auVar42._28_4_ = auVar223._28_4_;
    auVar20 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = fVar157 * fStack_2bc;
    auVar43._0_4_ = fVar193 * local_2c0;
    auVar43._8_4_ = fVar194 * fStack_2b8;
    auVar43._12_4_ = fVar158 * fStack_2b4;
    auVar43._16_4_ = fVar195 * fStack_2b0;
    auVar43._20_4_ = fVar159 * fStack_2ac;
    auVar43._24_4_ = fVar197 * fStack_2a8;
    auVar43._28_4_ = uVar60;
    auVar44._4_4_ = fVar211 * fStack_29c;
    auVar44._0_4_ = fVar210 * local_2a0;
    auVar44._8_4_ = fVar212 * fStack_298;
    auVar44._12_4_ = fVar88 * fStack_294;
    auVar44._16_4_ = fVar89 * fStack_290;
    auVar44._20_4_ = fVar90 * fStack_28c;
    auVar44._24_4_ = fVar91 * fStack_288;
    auVar44._28_4_ = auVar250._28_4_;
    auVar21 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar157 * local_200._4_4_;
    auVar45._0_4_ = fVar193 * local_200._0_4_;
    auVar45._8_4_ = fVar194 * local_200._8_4_;
    auVar45._12_4_ = fVar158 * local_200._12_4_;
    auVar45._16_4_ = fVar195 * local_200._16_4_;
    auVar45._20_4_ = fVar159 * local_200._20_4_;
    auVar45._24_4_ = fVar197 * local_200._24_4_;
    auVar45._28_4_ = auVar250._28_4_;
    auVar46._4_4_ = fStack_63c * fVar211;
    auVar46._0_4_ = local_640 * fVar210;
    auVar46._8_4_ = fStack_638 * fVar212;
    auVar46._12_4_ = fStack_634 * fVar88;
    auVar46._16_4_ = fStack_630 * fVar89;
    auVar46._20_4_ = fStack_62c * fVar90;
    auVar46._24_4_ = fStack_628 * fVar91;
    auVar46._28_4_ = local_240._28_4_;
    auVar22 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar157 * auVar18._4_4_;
    auVar47._0_4_ = fVar193 * auVar18._0_4_;
    auVar47._8_4_ = fVar194 * auVar18._8_4_;
    auVar47._12_4_ = fVar158 * auVar18._12_4_;
    auVar47._16_4_ = fVar195 * auVar18._16_4_;
    auVar47._20_4_ = fVar159 * auVar18._20_4_;
    auVar47._24_4_ = fVar197 * auVar18._24_4_;
    auVar47._28_4_ = auVar15._28_4_ + auVar16._28_4_;
    auVar48._4_4_ = auVar82._4_4_ * fVar211;
    auVar48._0_4_ = auVar82._0_4_ * fVar210;
    auVar48._8_4_ = auVar82._8_4_ * fVar212;
    auVar48._12_4_ = auVar82._12_4_ * fVar88;
    auVar48._16_4_ = auVar82._16_4_ * fVar89;
    auVar48._20_4_ = auVar82._20_4_ * fVar90;
    auVar48._24_4_ = auVar82._24_4_ * fVar91;
    auVar48._28_4_ = auVar14._28_4_ + fVar149;
    auVar18 = vsubps_avx(auVar47,auVar48);
    auVar16 = vminps_avx(auVar17,auVar19);
    auVar15 = vmaxps_avx(auVar17,auVar19);
    auVar13 = vminps_avx(auVar83,auVar84);
    auVar13 = vminps_avx(auVar16,auVar13);
    auVar16 = vmaxps_avx(auVar83,auVar84);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar14 = vminps_avx(auVar20,auVar21);
    auVar16 = vmaxps_avx(auVar20,auVar21);
    auVar82 = vminps_avx(auVar22,auVar18);
    auVar14 = vminps_avx(auVar14,auVar82);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar22,auVar18);
    auVar16 = vmaxps_avx(auVar16,auVar13);
    auVar16 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vcmpps_avx(auVar14,local_1c0,2);
    auVar16 = vcmpps_avx(auVar16,local_1e0,5);
    auVar15 = vandps_avx(auVar16,auVar15);
    auVar81 = vandps_avx(local_2e0,auVar81);
    auVar16 = auVar81 & auVar15;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar15,auVar81);
      uVar52 = vmovmskps_avx(auVar81);
      if (uVar52 != 0) {
        auStack_4c0[uVar59] = uVar52 & 0xff;
        uVar2 = vmovlps_avx(local_420);
        *(undefined8 *)(afStack_340 + uVar59 * 2) = uVar2;
        uVar3 = vmovlps_avx(auVar123);
        auStack_1a0[uVar59] = uVar3;
        uVar59 = (ulong)((int)uVar59 + 1);
      }
    }
  }
LAB_007d42e2:
  do {
    do {
      do {
        do {
          if ((int)uVar59 == 0) {
            if (bVar61) goto LAB_007d535d;
            uVar60 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar80._4_4_ = uVar60;
            auVar80._0_4_ = uVar60;
            auVar80._8_4_ = uVar60;
            auVar80._12_4_ = uVar60;
            auVar69 = vcmpps_avx(local_430,auVar80,2);
            uVar53 = vmovmskps_avx(auVar69);
            uVar54 = (ulong)((uint)uVar62 & uVar53);
            goto LAB_007d33bb;
          }
          uVar56 = (int)uVar59 - 1;
          uVar57 = (ulong)uVar56;
          uVar52 = auStack_4c0[uVar57];
          fVar149 = afStack_340[uVar57 * 2];
          fVar193 = afStack_340[uVar57 * 2 + 1];
          auVar292._8_8_ = 0;
          auVar292._0_8_ = auStack_1a0[uVar57];
          auVar296 = ZEXT1664(auVar292);
          uVar3 = 0;
          if (uVar52 != 0) {
            for (; (uVar52 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar52 = uVar52 - 1 & uVar52;
          auStack_4c0[uVar57] = uVar52;
          if (uVar52 == 0) {
            uVar59 = (ulong)uVar56;
          }
          fVar194 = (float)(uVar3 + 1) * 0.14285715;
          fVar157 = (1.0 - (float)uVar3 * 0.14285715) * fVar149 +
                    fVar193 * (float)uVar3 * 0.14285715;
          fVar149 = (1.0 - fVar194) * fVar149 + fVar193 * fVar194;
          fVar193 = fVar149 - fVar157;
          if (0.16666667 <= fVar193) {
            auVar69 = vinsertps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar149),0x10);
            auVar298 = ZEXT1664(auVar69);
            goto LAB_007d3c73;
          }
          auVar69 = vshufps_avx(auVar292,auVar292,0x50);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar202 = vsubps_avx(auVar98,auVar69);
          fVar194 = auVar69._0_4_;
          fVar158 = auVar69._4_4_;
          fVar195 = auVar69._8_4_;
          fVar159 = auVar69._12_4_;
          fVar197 = auVar202._0_4_;
          fVar210 = auVar202._4_4_;
          fVar211 = auVar202._8_4_;
          fVar212 = auVar202._12_4_;
          auVar128._0_4_ = auVar258._0_4_ * fVar194 + fVar197 * fVar92;
          auVar128._4_4_ = auVar258._4_4_ * fVar158 + fVar210 * fVar120;
          auVar128._8_4_ = auVar258._0_4_ * fVar195 + fVar211 * fVar92;
          auVar128._12_4_ = auVar258._4_4_ * fVar159 + fVar212 * fVar120;
          auVar165._0_4_ = auVar227._0_4_ * fVar194 + fVar197 * fVar93;
          auVar165._4_4_ = auVar227._4_4_ * fVar158 + fVar210 * fVar121;
          auVar165._8_4_ = auVar227._0_4_ * fVar195 + fVar211 * fVar93;
          auVar165._12_4_ = auVar227._4_4_ * fVar159 + fVar212 * fVar121;
          auVar185._0_4_ = auVar246._0_4_ * fVar194 + auVar290._0_4_ * fVar197;
          auVar185._4_4_ = auVar246._4_4_ * fVar158 + auVar290._4_4_ * fVar210;
          auVar185._8_4_ = auVar246._0_4_ * fVar195 + auVar290._0_4_ * fVar211;
          auVar185._12_4_ = auVar246._4_4_ * fVar159 + auVar290._4_4_ * fVar212;
          auVar66._0_4_ = auVar97._0_4_ * fVar194 + auVar286._0_4_ * fVar197;
          auVar66._4_4_ = auVar97._4_4_ * fVar158 + auVar286._4_4_ * fVar210;
          auVar66._8_4_ = auVar97._0_4_ * fVar195 + auVar286._0_4_ * fVar211;
          auVar66._12_4_ = auVar97._4_4_ * fVar159 + auVar286._4_4_ * fVar212;
          auVar116._16_16_ = auVar128;
          auVar116._0_16_ = auVar128;
          auVar146._16_16_ = auVar165;
          auVar146._0_16_ = auVar165;
          auVar175._16_16_ = auVar185;
          auVar175._0_16_ = auVar185;
          auVar81 = ZEXT2032(CONCAT416(fVar149,ZEXT416((uint)fVar157)));
          auVar81 = vshufps_avx(auVar81,auVar81,0);
          auVar15 = vsubps_avx(auVar146,auVar116);
          fVar194 = auVar81._0_4_;
          fVar158 = auVar81._4_4_;
          fVar195 = auVar81._8_4_;
          fVar159 = auVar81._12_4_;
          fVar197 = auVar81._16_4_;
          fVar210 = auVar81._20_4_;
          fVar211 = auVar81._24_4_;
          auVar117._0_4_ = auVar128._0_4_ + auVar15._0_4_ * fVar194;
          auVar117._4_4_ = auVar128._4_4_ + auVar15._4_4_ * fVar158;
          auVar117._8_4_ = auVar128._8_4_ + auVar15._8_4_ * fVar195;
          auVar117._12_4_ = auVar128._12_4_ + auVar15._12_4_ * fVar159;
          auVar117._16_4_ = auVar128._0_4_ + auVar15._16_4_ * fVar197;
          auVar117._20_4_ = auVar128._4_4_ + auVar15._20_4_ * fVar210;
          auVar117._24_4_ = auVar128._8_4_ + auVar15._24_4_ * fVar211;
          auVar117._28_4_ = auVar128._12_4_ + auVar15._28_4_;
          auVar81 = vsubps_avx(auVar175,auVar146);
          auVar147._0_4_ = auVar165._0_4_ + auVar81._0_4_ * fVar194;
          auVar147._4_4_ = auVar165._4_4_ + auVar81._4_4_ * fVar158;
          auVar147._8_4_ = auVar165._8_4_ + auVar81._8_4_ * fVar195;
          auVar147._12_4_ = auVar165._12_4_ + auVar81._12_4_ * fVar159;
          auVar147._16_4_ = auVar165._0_4_ + auVar81._16_4_ * fVar197;
          auVar147._20_4_ = auVar165._4_4_ + auVar81._20_4_ * fVar210;
          auVar147._24_4_ = auVar165._8_4_ + auVar81._24_4_ * fVar211;
          auVar147._28_4_ = auVar165._12_4_ + auVar81._28_4_;
          auVar69 = vsubps_avx(auVar66,auVar185);
          auVar85._0_4_ = auVar185._0_4_ + auVar69._0_4_ * fVar194;
          auVar85._4_4_ = auVar185._4_4_ + auVar69._4_4_ * fVar158;
          auVar85._8_4_ = auVar185._8_4_ + auVar69._8_4_ * fVar195;
          auVar85._12_4_ = auVar185._12_4_ + auVar69._12_4_ * fVar159;
          auVar85._16_4_ = auVar185._0_4_ + auVar69._0_4_ * fVar197;
          auVar85._20_4_ = auVar185._4_4_ + auVar69._4_4_ * fVar210;
          auVar85._24_4_ = auVar185._8_4_ + auVar69._8_4_ * fVar211;
          auVar85._28_4_ = auVar185._12_4_ + auVar69._12_4_;
          auVar81 = vsubps_avx(auVar147,auVar117);
          auVar118._0_4_ = auVar117._0_4_ + fVar194 * auVar81._0_4_;
          auVar118._4_4_ = auVar117._4_4_ + fVar158 * auVar81._4_4_;
          auVar118._8_4_ = auVar117._8_4_ + fVar195 * auVar81._8_4_;
          auVar118._12_4_ = auVar117._12_4_ + fVar159 * auVar81._12_4_;
          auVar118._16_4_ = auVar117._16_4_ + fVar197 * auVar81._16_4_;
          auVar118._20_4_ = auVar117._20_4_ + fVar210 * auVar81._20_4_;
          auVar118._24_4_ = auVar117._24_4_ + fVar211 * auVar81._24_4_;
          auVar118._28_4_ = auVar117._28_4_ + auVar81._28_4_;
          auVar81 = vsubps_avx(auVar85,auVar147);
          auVar86._0_4_ = auVar147._0_4_ + fVar194 * auVar81._0_4_;
          auVar86._4_4_ = auVar147._4_4_ + fVar158 * auVar81._4_4_;
          auVar86._8_4_ = auVar147._8_4_ + fVar195 * auVar81._8_4_;
          auVar86._12_4_ = auVar147._12_4_ + fVar159 * auVar81._12_4_;
          auVar86._16_4_ = auVar147._16_4_ + fVar197 * auVar81._16_4_;
          auVar86._20_4_ = auVar147._20_4_ + fVar210 * auVar81._20_4_;
          auVar86._24_4_ = auVar147._24_4_ + fVar211 * auVar81._24_4_;
          auVar86._28_4_ = auVar147._28_4_ + auVar81._28_4_;
          auVar81 = vsubps_avx(auVar86,auVar118);
          auVar205._0_4_ = auVar118._0_4_ + fVar194 * auVar81._0_4_;
          auVar205._4_4_ = auVar118._4_4_ + fVar158 * auVar81._4_4_;
          auVar205._8_4_ = auVar118._8_4_ + fVar195 * auVar81._8_4_;
          auVar205._12_4_ = auVar118._12_4_ + fVar159 * auVar81._12_4_;
          auVar209._16_4_ = auVar118._16_4_ + fVar197 * auVar81._16_4_;
          auVar209._0_16_ = auVar205;
          auVar209._20_4_ = auVar118._20_4_ + fVar210 * auVar81._20_4_;
          auVar209._24_4_ = auVar118._24_4_ + fVar211 * auVar81._24_4_;
          auVar209._28_4_ = auVar118._28_4_ + auVar147._28_4_;
          auVar95 = auVar209._16_16_;
          auVar100 = vshufps_avx(ZEXT416((uint)(fVar193 * 0.33333334)),
                                 ZEXT416((uint)(fVar193 * 0.33333334)),0);
          auVar166._0_4_ = auVar205._0_4_ + auVar100._0_4_ * auVar81._0_4_ * 3.0;
          auVar166._4_4_ = auVar205._4_4_ + auVar100._4_4_ * auVar81._4_4_ * 3.0;
          auVar166._8_4_ = auVar205._8_4_ + auVar100._8_4_ * auVar81._8_4_ * 3.0;
          auVar166._12_4_ = auVar205._12_4_ + auVar100._12_4_ * auVar81._12_4_ * 3.0;
          auVar144 = vshufpd_avx(auVar205,auVar205,3);
          auVar64 = vshufpd_avx(auVar95,auVar95,3);
          _local_560 = auVar144;
          auVar69 = vsubps_avx(auVar144,auVar205);
          auVar202 = vsubps_avx(auVar64,auVar95);
          auVar67._0_4_ = auVar69._0_4_ + auVar202._0_4_;
          auVar67._4_4_ = auVar69._4_4_ + auVar202._4_4_;
          auVar67._8_4_ = auVar69._8_4_ + auVar202._8_4_;
          auVar67._12_4_ = auVar69._12_4_ + auVar202._12_4_;
          auVar69 = vmovshdup_avx(auVar205);
          auVar202 = vmovshdup_avx(auVar166);
          auVar130 = vshufps_avx(auVar67,auVar67,0);
          auVar63 = vshufps_avx(auVar67,auVar67,0x55);
          fVar194 = auVar63._0_4_;
          fVar158 = auVar63._4_4_;
          fVar195 = auVar63._8_4_;
          fVar159 = auVar63._12_4_;
          fVar197 = auVar130._0_4_;
          fVar210 = auVar130._4_4_;
          fVar211 = auVar130._8_4_;
          fVar212 = auVar130._12_4_;
          auVar68._0_4_ = fVar197 * auVar205._0_4_ + auVar69._0_4_ * fVar194;
          auVar68._4_4_ = fVar210 * auVar205._4_4_ + auVar69._4_4_ * fVar158;
          auVar68._8_4_ = fVar211 * auVar205._8_4_ + auVar69._8_4_ * fVar195;
          auVar68._12_4_ = fVar212 * auVar205._12_4_ + auVar69._12_4_ * fVar159;
          auVar268._0_4_ = fVar197 * auVar166._0_4_ + auVar202._0_4_ * fVar194;
          auVar268._4_4_ = fVar210 * auVar166._4_4_ + auVar202._4_4_ * fVar158;
          auVar268._8_4_ = fVar211 * auVar166._8_4_ + auVar202._8_4_ * fVar195;
          auVar268._12_4_ = fVar212 * auVar166._12_4_ + auVar202._12_4_ * fVar159;
          auVar202 = vshufps_avx(auVar68,auVar68,0xe8);
          auVar130 = vshufps_avx(auVar268,auVar268,0xe8);
          auVar69 = vcmpps_avx(auVar202,auVar130,1);
          uVar52 = vextractps_avx(auVar69,0);
          auVar63 = auVar268;
          if ((uVar52 & 1) == 0) {
            auVar63 = auVar68;
          }
          auVar99._0_4_ = auVar100._0_4_ * auVar81._16_4_ * 3.0;
          auVar99._4_4_ = auVar100._4_4_ * auVar81._20_4_ * 3.0;
          auVar99._8_4_ = auVar100._8_4_ * auVar81._24_4_ * 3.0;
          auVar99._12_4_ = auVar100._12_4_ * 0.0;
          auVar94 = vsubps_avx(auVar95,auVar99);
          auVar100 = vmovshdup_avx(auVar94);
          auVar95 = vmovshdup_avx(auVar95);
          fVar88 = auVar94._0_4_;
          fVar89 = auVar94._4_4_;
          auVar186._0_4_ = fVar88 * fVar197 + auVar100._0_4_ * fVar194;
          auVar186._4_4_ = fVar89 * fVar210 + auVar100._4_4_ * fVar158;
          auVar186._8_4_ = auVar94._8_4_ * fVar211 + auVar100._8_4_ * fVar195;
          auVar186._12_4_ = auVar94._12_4_ * fVar212 + auVar100._12_4_ * fVar159;
          auVar297._0_4_ = fVar197 * auVar209._16_4_ + auVar95._0_4_ * fVar194;
          auVar297._4_4_ = fVar210 * auVar209._20_4_ + auVar95._4_4_ * fVar158;
          auVar297._8_4_ = fVar211 * auVar209._24_4_ + auVar95._8_4_ * fVar195;
          auVar297._12_4_ = fVar212 * auVar209._28_4_ + auVar95._12_4_ * fVar159;
          auVar95 = vshufps_avx(auVar186,auVar186,0xe8);
          auVar122 = vshufps_avx(auVar297,auVar297,0xe8);
          auVar100 = vcmpps_avx(auVar95,auVar122,1);
          uVar52 = vextractps_avx(auVar100,0);
          auVar123 = auVar297;
          if ((uVar52 & 1) == 0) {
            auVar123 = auVar186;
          }
          auVar63 = vmaxss_avx(auVar123,auVar63);
          auVar202 = vminps_avx(auVar202,auVar130);
          auVar130 = vminps_avx(auVar95,auVar122);
          auVar130 = vminps_avx(auVar202,auVar130);
          auVar69 = vshufps_avx(auVar69,auVar69,0x55);
          auVar69 = vblendps_avx(auVar69,auVar100,2);
          auVar100 = vpslld_avx(auVar69,0x1f);
          auVar69 = vshufpd_avx(auVar268,auVar268,1);
          auVar69 = vinsertps_avx(auVar69,auVar297,0x9c);
          auVar202 = vshufpd_avx(auVar68,auVar68,1);
          auVar202 = vinsertps_avx(auVar202,auVar186,0x9c);
          auVar69 = vblendvps_avx(auVar202,auVar69,auVar100);
          auVar202 = vmovshdup_avx(auVar69);
          auVar69 = vmaxss_avx(auVar202,auVar69);
          fVar195 = auVar130._0_4_;
          auVar202 = vmovshdup_avx(auVar130);
          fVar158 = auVar69._0_4_;
          fVar159 = auVar202._0_4_;
          fVar194 = auVar63._0_4_;
          if ((fVar195 < 0.0001) && (-0.0001 < fVar158)) break;
          if ((fVar159 < 0.0001 && -0.0001 < fVar194) || (fVar195 < 0.0001 && -0.0001 < fVar194))
          break;
          auVar100 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar69,1);
          auVar202 = vcmpps_avx(auVar202,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar202 = vandps_avx(auVar202,auVar100);
        } while ((auVar202 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar100 = vcmpps_avx(auVar130,_DAT_01f45a50,1);
        auVar202 = vcmpss_avx(auVar63,ZEXT416(0) << 0x20,1);
        auVar129._8_4_ = 0x3f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        auVar129._12_4_ = 0x3f800000;
        auVar167._8_4_ = 0xbf800000;
        auVar167._0_8_ = 0xbf800000bf800000;
        auVar167._12_4_ = 0xbf800000;
        auVar202 = vblendvps_avx(auVar129,auVar167,auVar202);
        auVar100 = vblendvps_avx(auVar129,auVar167,auVar100);
        auVar130 = vcmpss_avx(auVar100,auVar202,4);
        auVar130 = vpshufd_avx(ZEXT416(auVar130._0_4_ & 1),0x50);
        auVar130 = vpslld_avx(auVar130,0x1f);
        auVar130 = vpsrad_avx(auVar130,0x1f);
        auVar130 = vpandn_avx(auVar130,_DAT_01f7afb0);
        auVar63 = vmovshdup_avx(auVar100);
        fVar197 = auVar63._0_4_;
        if ((auVar100._0_4_ != fVar197) || (NAN(auVar100._0_4_) || NAN(fVar197))) {
          if ((fVar159 != fVar195) || (NAN(fVar159) || NAN(fVar195))) {
            fVar195 = -fVar195 / (fVar159 - fVar195);
            auVar100 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar195) * 0.0 + fVar195)));
          }
          else {
            auVar100 = ZEXT816(0x3f80000000000000);
            if ((fVar195 != 0.0) || (NAN(fVar195))) {
              auVar100 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar95 = vcmpps_avx(auVar130,auVar100,1);
          auVar63 = vblendps_avx(auVar130,auVar100,2);
          auVar100 = vblendps_avx(auVar100,auVar130,2);
          auVar130 = vblendvps_avx(auVar100,auVar63,auVar95);
        }
        auVar69 = vcmpss_avx(auVar69,ZEXT416(0) << 0x20,1);
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar131._12_4_ = 0x3f800000;
        auVar168._8_4_ = 0xbf800000;
        auVar168._0_8_ = 0xbf800000bf800000;
        auVar168._12_4_ = 0xbf800000;
        auVar69 = vblendvps_avx(auVar131,auVar168,auVar69);
        fVar195 = auVar69._0_4_;
        if ((auVar202._0_4_ != fVar195) || (NAN(auVar202._0_4_) || NAN(fVar195))) {
          if ((fVar158 != fVar194) || (NAN(fVar158) || NAN(fVar194))) {
            fVar194 = -fVar194 / (fVar158 - fVar194);
            auVar69 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar194) * 0.0 + fVar194)));
          }
          else {
            auVar69 = ZEXT816(0x3f80000000000000);
            if ((fVar194 != 0.0) || (NAN(fVar194))) {
              auVar69 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar100 = vcmpps_avx(auVar130,auVar69,1);
          auVar202 = vblendps_avx(auVar130,auVar69,2);
          auVar69 = vblendps_avx(auVar69,auVar130,2);
          auVar130 = vblendvps_avx(auVar69,auVar202,auVar100);
        }
        if ((fVar197 != fVar195) || (NAN(fVar197) || NAN(fVar195))) {
          auVar70._8_4_ = 0x3f800000;
          auVar70._0_8_ = 0x3f8000003f800000;
          auVar70._12_4_ = 0x3f800000;
          auVar69 = vcmpps_avx(auVar130,auVar70,1);
          auVar202 = vinsertps_avx(auVar130,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar132._4_12_ = auVar130._4_12_;
          auVar132._0_4_ = 0x3f800000;
          auVar130 = vblendvps_avx(auVar132,auVar202,auVar69);
        }
        auVar69 = vcmpps_avx(auVar130,_DAT_01f46740,1);
        auVar50._12_4_ = 0;
        auVar50._0_12_ = auVar130._4_12_;
        auVar202 = vinsertps_avx(auVar130,ZEXT416(0x3f800000),0x10);
        auVar69 = vblendvps_avx(auVar202,auVar50 << 0x20,auVar69);
        auVar202 = vmovshdup_avx(auVar69);
      } while (auVar202._0_4_ < auVar69._0_4_);
      auVar71._0_4_ = auVar69._0_4_ + -0.1;
      auVar71._4_4_ = auVar69._4_4_ + 0.1;
      auVar71._8_4_ = auVar69._8_4_ + 0.0;
      auVar71._12_4_ = auVar69._12_4_ + 0.0;
      auVar100 = vshufpd_avx(auVar166,auVar166,3);
      auVar206._8_8_ = 0x3f80000000000000;
      auVar206._0_8_ = 0x3f80000000000000;
      auVar69 = vcmpps_avx(auVar71,auVar206,1);
      auVar49._12_4_ = 0;
      auVar49._0_12_ = auVar71._4_12_;
      auVar202 = vinsertps_avx(auVar71,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar69 = vblendvps_avx(auVar202,auVar49 << 0x20,auVar69);
      auVar202 = vshufpd_avx(auVar94,auVar94,3);
      auVar130 = vshufps_avx(auVar69,auVar69,0x50);
      auVar207._8_4_ = 0x3f800000;
      auVar207._0_8_ = 0x3f8000003f800000;
      auVar207._12_4_ = 0x3f800000;
      auVar63 = vsubps_avx(auVar207,auVar130);
      local_560._0_4_ = auVar144._0_4_;
      local_560._4_4_ = auVar144._4_4_;
      fStack_558 = auVar144._8_4_;
      fStack_554 = auVar144._12_4_;
      fVar194 = auVar130._0_4_;
      fVar158 = auVar130._4_4_;
      fVar195 = auVar130._8_4_;
      fVar159 = auVar130._12_4_;
      local_680 = auVar64._0_4_;
      fStack_67c = auVar64._4_4_;
      fStack_678 = auVar64._8_4_;
      fStack_674 = auVar64._12_4_;
      fVar197 = auVar63._0_4_;
      fVar210 = auVar63._4_4_;
      fVar211 = auVar63._8_4_;
      fVar212 = auVar63._12_4_;
      auVar72._0_4_ = fVar194 * (float)local_560._0_4_ + fVar197 * auVar205._0_4_;
      auVar72._4_4_ = fVar158 * (float)local_560._4_4_ + fVar210 * auVar205._4_4_;
      auVar72._8_4_ = fVar195 * fStack_558 + fVar211 * auVar205._0_4_;
      auVar72._12_4_ = fVar159 * fStack_554 + fVar212 * auVar205._4_4_;
      auVar187._0_4_ = auVar100._0_4_ * fVar194 + fVar197 * auVar166._0_4_;
      auVar187._4_4_ = auVar100._4_4_ * fVar158 + fVar210 * auVar166._4_4_;
      auVar187._8_4_ = auVar100._8_4_ * fVar195 + fVar211 * auVar166._0_4_;
      auVar187._12_4_ = auVar100._12_4_ * fVar159 + fVar212 * auVar166._4_4_;
      auVar222._0_4_ = auVar202._0_4_ * fVar194 + fVar197 * fVar88;
      auVar222._4_4_ = auVar202._4_4_ * fVar158 + fVar210 * fVar89;
      auVar222._8_4_ = auVar202._8_4_ * fVar195 + fVar211 * fVar88;
      auVar222._12_4_ = auVar202._12_4_ * fVar159 + fVar212 * fVar89;
      auVar259._0_4_ = fVar194 * local_680 + fVar197 * auVar209._16_4_;
      auVar259._4_4_ = fVar158 * fStack_67c + fVar210 * auVar209._20_4_;
      auVar259._8_4_ = fVar195 * fStack_678 + fVar211 * auVar209._16_4_;
      auVar259._12_4_ = fVar159 * fStack_674 + fVar212 * auVar209._20_4_;
      auVar64 = vsubps_avx(auVar207,auVar69);
      auVar202 = vmovshdup_avx(auVar292);
      auVar144 = vmovsldup_avx(auVar292);
      auVar208._0_4_ = auVar64._0_4_ * auVar144._0_4_ + auVar69._0_4_ * auVar202._0_4_;
      auVar208._4_4_ = auVar64._4_4_ * auVar144._4_4_ + auVar69._4_4_ * auVar202._4_4_;
      auVar208._8_4_ = auVar64._8_4_ * auVar144._8_4_ + auVar69._8_4_ * auVar202._8_4_;
      auVar208._12_4_ = auVar64._12_4_ * auVar144._12_4_ + auVar69._12_4_ * auVar202._12_4_;
      auVar94 = vmovshdup_avx(auVar208);
      auVar69 = vsubps_avx(auVar187,auVar72);
      auVar133._0_4_ = auVar69._0_4_ * 3.0;
      auVar133._4_4_ = auVar69._4_4_ * 3.0;
      auVar133._8_4_ = auVar69._8_4_ * 3.0;
      auVar133._12_4_ = auVar69._12_4_ * 3.0;
      auVar69 = vsubps_avx(auVar222,auVar187);
      auVar153._0_4_ = auVar69._0_4_ * 3.0;
      auVar153._4_4_ = auVar69._4_4_ * 3.0;
      auVar153._8_4_ = auVar69._8_4_ * 3.0;
      auVar153._12_4_ = auVar69._12_4_ * 3.0;
      auVar69 = vsubps_avx(auVar259,auVar222);
      auVar228._0_4_ = auVar69._0_4_ * 3.0;
      auVar228._4_4_ = auVar69._4_4_ * 3.0;
      auVar228._8_4_ = auVar69._8_4_ * 3.0;
      auVar228._12_4_ = auVar69._12_4_ * 3.0;
      auVar202 = vminps_avx(auVar153,auVar228);
      auVar69 = vmaxps_avx(auVar153,auVar228);
      auVar202 = vminps_avx(auVar133,auVar202);
      auVar69 = vmaxps_avx(auVar133,auVar69);
      auVar144 = vshufpd_avx(auVar202,auVar202,3);
      auVar64 = vshufpd_avx(auVar69,auVar69,3);
      auVar202 = vminps_avx(auVar202,auVar144);
      auVar69 = vmaxps_avx(auVar69,auVar64);
      auVar144 = vshufps_avx(ZEXT416((uint)(1.0 / fVar193)),ZEXT416((uint)(1.0 / fVar193)),0);
      auVar229._0_4_ = auVar144._0_4_ * auVar202._0_4_;
      auVar229._4_4_ = auVar144._4_4_ * auVar202._4_4_;
      auVar229._8_4_ = auVar144._8_4_ * auVar202._8_4_;
      auVar229._12_4_ = auVar144._12_4_ * auVar202._12_4_;
      auVar247._0_4_ = auVar144._0_4_ * auVar69._0_4_;
      auVar247._4_4_ = auVar144._4_4_ * auVar69._4_4_;
      auVar247._8_4_ = auVar144._8_4_ * auVar69._8_4_;
      auVar247._12_4_ = auVar144._12_4_ * auVar69._12_4_;
      auVar63 = ZEXT416((uint)(1.0 / (auVar94._0_4_ - auVar208._0_4_)));
      auVar69 = vshufpd_avx(auVar72,auVar72,3);
      auVar202 = vshufpd_avx(auVar187,auVar187,3);
      auVar144 = vshufpd_avx(auVar222,auVar222,3);
      auVar64 = vshufpd_avx(auVar259,auVar259,3);
      auVar69 = vsubps_avx(auVar69,auVar72);
      auVar100 = vsubps_avx(auVar202,auVar187);
      auVar130 = vsubps_avx(auVar144,auVar222);
      auVar64 = vsubps_avx(auVar64,auVar259);
      auVar202 = vminps_avx(auVar69,auVar100);
      auVar69 = vmaxps_avx(auVar69,auVar100);
      auVar144 = vminps_avx(auVar130,auVar64);
      auVar144 = vminps_avx(auVar202,auVar144);
      auVar202 = vmaxps_avx(auVar130,auVar64);
      auVar69 = vmaxps_avx(auVar69,auVar202);
      auVar202 = vshufps_avx(auVar63,auVar63,0);
      auVar287._0_4_ = auVar202._0_4_ * auVar144._0_4_;
      auVar287._4_4_ = auVar202._4_4_ * auVar144._4_4_;
      auVar287._8_4_ = auVar202._8_4_ * auVar144._8_4_;
      auVar287._12_4_ = auVar202._12_4_ * auVar144._12_4_;
      auVar293._0_4_ = auVar202._0_4_ * auVar69._0_4_;
      auVar293._4_4_ = auVar202._4_4_ * auVar69._4_4_;
      auVar293._8_4_ = auVar202._8_4_ * auVar69._8_4_;
      auVar293._12_4_ = auVar202._12_4_ * auVar69._12_4_;
      auVar69 = vmovsldup_avx(auVar208);
      auVar260._4_12_ = auVar69._4_12_;
      auVar260._0_4_ = fVar157;
      auVar269._4_12_ = auVar208._4_12_;
      auVar269._0_4_ = fVar149;
      auVar154._0_4_ = (fVar157 + fVar149) * 0.5;
      auVar154._4_4_ = (auVar69._4_4_ + auVar208._4_4_) * 0.5;
      auVar154._8_4_ = (auVar69._8_4_ + auVar208._8_4_) * 0.5;
      auVar154._12_4_ = (auVar69._12_4_ + auVar208._12_4_) * 0.5;
      auVar69 = vshufps_avx(auVar154,auVar154,0);
      fVar194 = auVar69._0_4_;
      fVar158 = auVar69._4_4_;
      fVar195 = auVar69._8_4_;
      fVar159 = auVar69._12_4_;
      local_700 = auVar11._0_4_;
      fStack_6fc = auVar11._4_4_;
      fStack_6f8 = auVar11._8_4_;
      fStack_6f4 = auVar11._12_4_;
      auVar101._0_4_ = fVar194 * (float)local_350._0_4_ + local_700;
      auVar101._4_4_ = fVar158 * (float)local_350._4_4_ + fStack_6fc;
      auVar101._8_4_ = fVar195 * fStack_348 + fStack_6f8;
      auVar101._12_4_ = fVar159 * fStack_344 + fStack_6f4;
      local_690._0_4_ = auVar267._0_4_;
      local_690._4_4_ = auVar267._4_4_;
      fStack_688 = auVar267._8_4_;
      fStack_684 = auVar267._12_4_;
      auVar134._0_4_ = fVar194 * (float)local_360._0_4_ + (float)local_690._0_4_;
      auVar134._4_4_ = fVar158 * (float)local_360._4_4_ + (float)local_690._4_4_;
      auVar134._8_4_ = fVar195 * fStack_358 + fStack_688;
      auVar134._12_4_ = fVar159 * fStack_354 + fStack_684;
      local_5b0 = auVar12._0_4_;
      fStack_5ac = auVar12._4_4_;
      fStack_5a8 = auVar12._8_4_;
      fStack_5a4 = auVar12._12_4_;
      auVar188._0_4_ = fVar194 * (float)local_370._0_4_ + local_5b0;
      auVar188._4_4_ = fVar158 * (float)local_370._4_4_ + fStack_5ac;
      auVar188._8_4_ = fVar195 * fStack_368 + fStack_5a8;
      auVar188._12_4_ = fVar159 * fStack_364 + fStack_5a4;
      auVar69 = vsubps_avx(auVar134,auVar101);
      auVar102._0_4_ = auVar101._0_4_ + fVar194 * auVar69._0_4_;
      auVar102._4_4_ = auVar101._4_4_ + fVar158 * auVar69._4_4_;
      auVar102._8_4_ = auVar101._8_4_ + fVar195 * auVar69._8_4_;
      auVar102._12_4_ = auVar101._12_4_ + fVar159 * auVar69._12_4_;
      auVar69 = vsubps_avx(auVar188,auVar134);
      auVar135._0_4_ = auVar134._0_4_ + fVar194 * auVar69._0_4_;
      auVar135._4_4_ = auVar134._4_4_ + fVar158 * auVar69._4_4_;
      auVar135._8_4_ = auVar134._8_4_ + fVar195 * auVar69._8_4_;
      auVar135._12_4_ = auVar134._12_4_ + fVar159 * auVar69._12_4_;
      auVar69 = vsubps_avx(auVar135,auVar102);
      fVar194 = auVar102._0_4_ + fVar194 * auVar69._0_4_;
      fVar158 = auVar102._4_4_ + fVar158 * auVar69._4_4_;
      auVar73._0_8_ = CONCAT44(fVar158,fVar194);
      auVar73._8_4_ = auVar102._8_4_ + fVar195 * auVar69._8_4_;
      auVar73._12_4_ = auVar102._12_4_ + fVar159 * auVar69._12_4_;
      fVar195 = auVar69._0_4_ * 3.0;
      fVar159 = auVar69._4_4_ * 3.0;
      auVar103._0_8_ = CONCAT44(fVar159,fVar195);
      auVar103._8_4_ = auVar69._8_4_ * 3.0;
      auVar103._12_4_ = auVar69._12_4_ * 3.0;
      auVar136._8_8_ = auVar73._0_8_;
      auVar136._0_8_ = auVar73._0_8_;
      auVar69 = vshufpd_avx(auVar73,auVar73,3);
      auVar202 = vshufps_avx(auVar154,auVar154,0x55);
      auVar130 = vsubps_avx(auVar69,auVar136);
      auVar275._0_4_ = auVar130._0_4_ * auVar202._0_4_ + fVar194;
      auVar275._4_4_ = auVar130._4_4_ * auVar202._4_4_ + fVar158;
      auVar275._8_4_ = auVar130._8_4_ * auVar202._8_4_ + fVar194;
      auVar275._12_4_ = auVar130._12_4_ * auVar202._12_4_ + fVar158;
      auVar137._8_8_ = auVar103._0_8_;
      auVar137._0_8_ = auVar103._0_8_;
      auVar69 = vshufpd_avx(auVar103,auVar103,1);
      auVar69 = vsubps_avx(auVar69,auVar137);
      auVar104._0_4_ = auVar69._0_4_ * auVar202._0_4_ + fVar195;
      auVar104._4_4_ = auVar69._4_4_ * auVar202._4_4_ + fVar159;
      auVar104._8_4_ = auVar69._8_4_ * auVar202._8_4_ + fVar195;
      auVar104._12_4_ = auVar69._12_4_ * auVar202._12_4_ + fVar159;
      auVar202 = vmovshdup_avx(auVar104);
      auVar189._0_8_ = auVar202._0_8_ ^ 0x8000000080000000;
      auVar189._8_4_ = auVar202._8_4_ ^ 0x80000000;
      auVar189._12_4_ = auVar202._12_4_ ^ 0x80000000;
      auVar144 = vmovshdup_avx(auVar130);
      auVar69 = vunpcklps_avx(auVar144,auVar189);
      auVar64 = vshufps_avx(auVar69,auVar189,4);
      auVar74._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = -auVar130._8_4_;
      auVar74._12_4_ = -auVar130._12_4_;
      auVar69 = vmovlhps_avx(auVar74,auVar104);
      auVar100 = vshufps_avx(auVar69,auVar104,8);
      auVar69 = ZEXT416((uint)(auVar104._0_4_ * auVar144._0_4_ - auVar130._0_4_ * auVar202._0_4_));
      auVar202 = vshufps_avx(auVar69,auVar69,0);
      auVar69 = vdivps_avx(auVar64,auVar202);
      auVar202 = vdivps_avx(auVar100,auVar202);
      auVar100 = vinsertps_avx(auVar229,auVar287,0x1c);
      auVar130 = vinsertps_avx(auVar247,auVar293,0x1c);
      auVar63 = vinsertps_avx(auVar287,auVar229,0x4c);
      auVar95 = vinsertps_avx(auVar293,auVar247,0x4c);
      auVar144 = vmovsldup_avx(auVar69);
      auVar138._0_4_ = auVar144._0_4_ * auVar100._0_4_;
      auVar138._4_4_ = auVar144._4_4_ * auVar100._4_4_;
      auVar138._8_4_ = auVar144._8_4_ * auVar100._8_4_;
      auVar138._12_4_ = auVar144._12_4_ * auVar100._12_4_;
      auVar105._0_4_ = auVar130._0_4_ * auVar144._0_4_;
      auVar105._4_4_ = auVar130._4_4_ * auVar144._4_4_;
      auVar105._8_4_ = auVar130._8_4_ * auVar144._8_4_;
      auVar105._12_4_ = auVar130._12_4_ * auVar144._12_4_;
      auVar64 = vminps_avx(auVar138,auVar105);
      auVar144 = vmaxps_avx(auVar105,auVar138);
      auVar122 = vmovsldup_avx(auVar202);
      auVar294._0_4_ = auVar63._0_4_ * auVar122._0_4_;
      auVar294._4_4_ = auVar63._4_4_ * auVar122._4_4_;
      auVar294._8_4_ = auVar63._8_4_ * auVar122._8_4_;
      auVar294._12_4_ = auVar63._12_4_ * auVar122._12_4_;
      auVar139._0_4_ = auVar95._0_4_ * auVar122._0_4_;
      auVar139._4_4_ = auVar95._4_4_ * auVar122._4_4_;
      auVar139._8_4_ = auVar95._8_4_ * auVar122._8_4_;
      auVar139._12_4_ = auVar95._12_4_ * auVar122._12_4_;
      auVar122 = vminps_avx(auVar294,auVar139);
      auVar169._0_4_ = auVar64._0_4_ + auVar122._0_4_;
      auVar169._4_4_ = auVar64._4_4_ + auVar122._4_4_;
      auVar169._8_4_ = auVar64._8_4_ + auVar122._8_4_;
      auVar169._12_4_ = auVar64._12_4_ + auVar122._12_4_;
      auVar64 = vmaxps_avx(auVar139,auVar294);
      auVar122 = vsubps_avx(auVar260,auVar154);
      auVar123 = vsubps_avx(auVar269,auVar154);
      auVar106._0_4_ = auVar144._0_4_ + auVar64._0_4_;
      auVar106._4_4_ = auVar144._4_4_ + auVar64._4_4_;
      auVar106._8_4_ = auVar144._8_4_ + auVar64._8_4_;
      auVar106._12_4_ = auVar144._12_4_ + auVar64._12_4_;
      auVar140._8_8_ = 0x3f800000;
      auVar140._0_8_ = 0x3f800000;
      auVar144 = vsubps_avx(auVar140,auVar106);
      auVar64 = vsubps_avx(auVar140,auVar169);
      fVar211 = auVar122._0_4_;
      auVar170._0_4_ = fVar211 * auVar144._0_4_;
      fVar212 = auVar122._4_4_;
      auVar170._4_4_ = fVar212 * auVar144._4_4_;
      fVar88 = auVar122._8_4_;
      auVar170._8_4_ = fVar88 * auVar144._8_4_;
      fVar89 = auVar122._12_4_;
      auVar170._12_4_ = fVar89 * auVar144._12_4_;
      fVar195 = auVar123._0_4_;
      auVar107._0_4_ = fVar195 * auVar144._0_4_;
      fVar159 = auVar123._4_4_;
      auVar107._4_4_ = fVar159 * auVar144._4_4_;
      fVar197 = auVar123._8_4_;
      auVar107._8_4_ = fVar197 * auVar144._8_4_;
      fVar210 = auVar123._12_4_;
      auVar107._12_4_ = fVar210 * auVar144._12_4_;
      auVar261._0_4_ = fVar211 * auVar64._0_4_;
      auVar261._4_4_ = fVar212 * auVar64._4_4_;
      auVar261._8_4_ = fVar88 * auVar64._8_4_;
      auVar261._12_4_ = fVar89 * auVar64._12_4_;
      auVar141._0_4_ = fVar195 * auVar64._0_4_;
      auVar141._4_4_ = fVar159 * auVar64._4_4_;
      auVar141._8_4_ = fVar197 * auVar64._8_4_;
      auVar141._12_4_ = fVar210 * auVar64._12_4_;
      auVar144 = vminps_avx(auVar170,auVar261);
      auVar64 = vminps_avx(auVar107,auVar141);
      auVar122 = vminps_avx(auVar144,auVar64);
      auVar144 = vmaxps_avx(auVar261,auVar170);
      auVar64 = vmaxps_avx(auVar141,auVar107);
      auVar123 = vshufps_avx(auVar154,auVar154,0x54);
      auVar64 = vmaxps_avx(auVar64,auVar144);
      auVar124 = vshufps_avx(auVar275,auVar275,0);
      auVar150 = vshufps_avx(auVar275,auVar275,0x55);
      auVar144 = vhaddps_avx(auVar122,auVar122);
      auVar64 = vhaddps_avx(auVar64,auVar64);
      auVar155._0_4_ = auVar124._0_4_ * auVar69._0_4_ + auVar150._0_4_ * auVar202._0_4_;
      auVar155._4_4_ = auVar124._4_4_ * auVar69._4_4_ + auVar150._4_4_ * auVar202._4_4_;
      auVar155._8_4_ = auVar124._8_4_ * auVar69._8_4_ + auVar150._8_4_ * auVar202._8_4_;
      auVar155._12_4_ = auVar124._12_4_ * auVar69._12_4_ + auVar150._12_4_ * auVar202._12_4_;
      auVar122 = vsubps_avx(auVar123,auVar155);
      fVar194 = auVar122._0_4_ + auVar144._0_4_;
      fVar158 = auVar122._0_4_ + auVar64._0_4_;
      auVar144 = vmaxss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar194));
      auVar64 = vminss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar149));
    } while (auVar64._0_4_ < auVar144._0_4_);
    auVar144 = vmovshdup_avx(auVar69);
    auVar75._0_4_ = auVar144._0_4_ * auVar100._0_4_;
    auVar75._4_4_ = auVar144._4_4_ * auVar100._4_4_;
    auVar75._8_4_ = auVar144._8_4_ * auVar100._8_4_;
    auVar75._12_4_ = auVar144._12_4_ * auVar100._12_4_;
    auVar108._0_4_ = auVar130._0_4_ * auVar144._0_4_;
    auVar108._4_4_ = auVar130._4_4_ * auVar144._4_4_;
    auVar108._8_4_ = auVar130._8_4_ * auVar144._8_4_;
    auVar108._12_4_ = auVar130._12_4_ * auVar144._12_4_;
    auVar64 = vminps_avx(auVar75,auVar108);
    auVar144 = vmaxps_avx(auVar108,auVar75);
    auVar100 = vmovshdup_avx(auVar202);
    auVar171._0_4_ = auVar63._0_4_ * auVar100._0_4_;
    auVar171._4_4_ = auVar63._4_4_ * auVar100._4_4_;
    auVar171._8_4_ = auVar63._8_4_ * auVar100._8_4_;
    auVar171._12_4_ = auVar63._12_4_ * auVar100._12_4_;
    auVar109._0_4_ = auVar95._0_4_ * auVar100._0_4_;
    auVar109._4_4_ = auVar95._4_4_ * auVar100._4_4_;
    auVar109._8_4_ = auVar95._8_4_ * auVar100._8_4_;
    auVar109._12_4_ = auVar95._12_4_ * auVar100._12_4_;
    auVar100 = vminps_avx(auVar171,auVar109);
    auVar142._0_4_ = auVar64._0_4_ + auVar100._0_4_;
    auVar142._4_4_ = auVar64._4_4_ + auVar100._4_4_;
    auVar142._8_4_ = auVar64._8_4_ + auVar100._8_4_;
    auVar142._12_4_ = auVar64._12_4_ + auVar100._12_4_;
    auVar64 = vmaxps_avx(auVar109,auVar171);
    auVar76._0_4_ = auVar144._0_4_ + auVar64._0_4_;
    auVar76._4_4_ = auVar144._4_4_ + auVar64._4_4_;
    auVar76._8_4_ = auVar144._8_4_ + auVar64._8_4_;
    auVar76._12_4_ = auVar144._12_4_ + auVar64._12_4_;
    auVar144 = vsubps_avx(auVar206,auVar76);
    auVar64 = vsubps_avx(auVar206,auVar142);
    auVar143._0_4_ = fVar211 * auVar144._0_4_;
    auVar143._4_4_ = fVar212 * auVar144._4_4_;
    auVar143._8_4_ = fVar88 * auVar144._8_4_;
    auVar143._12_4_ = fVar89 * auVar144._12_4_;
    auVar172._0_4_ = fVar211 * auVar64._0_4_;
    auVar172._4_4_ = fVar212 * auVar64._4_4_;
    auVar172._8_4_ = fVar88 * auVar64._8_4_;
    auVar172._12_4_ = fVar89 * auVar64._12_4_;
    auVar77._0_4_ = fVar195 * auVar144._0_4_;
    auVar77._4_4_ = fVar159 * auVar144._4_4_;
    auVar77._8_4_ = fVar197 * auVar144._8_4_;
    auVar77._12_4_ = fVar210 * auVar144._12_4_;
    auVar110._0_4_ = fVar195 * auVar64._0_4_;
    auVar110._4_4_ = fVar159 * auVar64._4_4_;
    auVar110._8_4_ = fVar197 * auVar64._8_4_;
    auVar110._12_4_ = fVar210 * auVar64._12_4_;
    auVar144 = vminps_avx(auVar143,auVar172);
    auVar64 = vminps_avx(auVar77,auVar110);
    auVar144 = vminps_avx(auVar144,auVar64);
    auVar64 = vmaxps_avx(auVar172,auVar143);
    auVar100 = vmaxps_avx(auVar110,auVar77);
    auVar144 = vhaddps_avx(auVar144,auVar144);
    auVar64 = vmaxps_avx(auVar100,auVar64);
    auVar64 = vhaddps_avx(auVar64,auVar64);
    auVar100 = vmovshdup_avx(auVar122);
    auVar130 = ZEXT416((uint)(auVar100._0_4_ + auVar144._0_4_));
    auVar144 = vmaxss_avx(auVar208,auVar130);
    auVar100 = ZEXT416((uint)(auVar100._0_4_ + auVar64._0_4_));
    auVar64 = vminss_avx(auVar100,auVar94);
  } while (auVar64._0_4_ < auVar144._0_4_);
  uVar52 = 0;
  if ((fVar157 < fVar194) && (fVar158 < fVar149)) {
    auVar144 = vcmpps_avx(auVar100,auVar94,1);
    auVar64 = vcmpps_avx(auVar208,auVar130,1);
    auVar144 = vandps_avx(auVar64,auVar144);
    uVar52 = auVar144._0_4_;
  }
  auVar230._8_4_ = 0x7fffffff;
  auVar230._0_8_ = 0x7fffffff7fffffff;
  auVar230._12_4_ = 0x7fffffff;
  if (((uint)uVar59 < 4 && 0.001 <= fVar193) && (uVar52 & 1) == 0) goto LAB_007d52c4;
  lVar55 = 0xc9;
  do {
    lVar55 = lVar55 + -1;
    if (lVar55 == 0) goto LAB_007d42e2;
    fVar193 = auVar122._0_4_;
    fVar149 = 1.0 - fVar193;
    auVar144 = ZEXT416((uint)(fVar149 * fVar149 * fVar149));
    auVar144 = vshufps_avx(auVar144,auVar144,0);
    auVar64 = ZEXT416((uint)(fVar193 * 3.0 * fVar149 * fVar149));
    auVar64 = vshufps_avx(auVar64,auVar64,0);
    auVar100 = ZEXT416((uint)(fVar149 * fVar193 * fVar193 * 3.0));
    auVar100 = vshufps_avx(auVar100,auVar100,0);
    auVar130 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
    auVar130 = vshufps_avx(auVar130,auVar130,0);
    fVar149 = local_700 * auVar144._0_4_ +
              (float)local_690._0_4_ * auVar64._0_4_ +
              (float)local_380._0_4_ * auVar130._0_4_ + local_5b0 * auVar100._0_4_;
    fVar193 = fStack_6fc * auVar144._4_4_ +
              (float)local_690._4_4_ * auVar64._4_4_ +
              (float)local_380._4_4_ * auVar130._4_4_ + fStack_5ac * auVar100._4_4_;
    auVar78._0_8_ = CONCAT44(fVar193,fVar149);
    auVar78._8_4_ =
         fStack_6f8 * auVar144._8_4_ +
         fStack_688 * auVar64._8_4_ + fStack_378 * auVar130._8_4_ + fStack_5a8 * auVar100._8_4_;
    auVar78._12_4_ =
         fStack_6f4 * auVar144._12_4_ +
         fStack_684 * auVar64._12_4_ + fStack_374 * auVar130._12_4_ + fStack_5a4 * auVar100._12_4_;
    auVar111._8_8_ = auVar78._0_8_;
    auVar111._0_8_ = auVar78._0_8_;
    auVar64 = vshufpd_avx(auVar78,auVar78,1);
    auVar144 = vmovshdup_avx(auVar122);
    auVar64 = vsubps_avx(auVar64,auVar111);
    auVar79._0_4_ = auVar144._0_4_ * auVar64._0_4_ + fVar149;
    auVar79._4_4_ = auVar144._4_4_ * auVar64._4_4_ + fVar193;
    auVar79._8_4_ = auVar144._8_4_ * auVar64._8_4_ + fVar149;
    auVar79._12_4_ = auVar144._12_4_ * auVar64._12_4_ + fVar193;
    auVar144 = vshufps_avx(auVar79,auVar79,0);
    auVar64 = vshufps_avx(auVar79,auVar79,0x55);
    auVar112._0_4_ = auVar69._0_4_ * auVar144._0_4_ + auVar202._0_4_ * auVar64._0_4_;
    auVar112._4_4_ = auVar69._4_4_ * auVar144._4_4_ + auVar202._4_4_ * auVar64._4_4_;
    auVar112._8_4_ = auVar69._8_4_ * auVar144._8_4_ + auVar202._8_4_ * auVar64._8_4_;
    auVar112._12_4_ = auVar69._12_4_ * auVar144._12_4_ + auVar202._12_4_ * auVar64._12_4_;
    auVar122 = vsubps_avx(auVar122,auVar112);
    auVar144 = vandps_avx(auVar230,auVar79);
    auVar64 = vshufps_avx(auVar144,auVar144,0xf5);
    auVar144 = vmaxss_avx(auVar64,auVar144);
  } while ((float)local_390._0_4_ <= auVar144._0_4_);
  fVar149 = auVar122._0_4_;
  if ((fVar149 < 0.0) || (1.0 < fVar149)) goto LAB_007d42e2;
  auVar69 = vmovshdup_avx(auVar122);
  fVar193 = auVar69._0_4_;
  if ((fVar193 < 0.0) || (1.0 < fVar193)) goto LAB_007d42e2;
  auVar69 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar95 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar69 = vdpps_avx(auVar95,local_3a0,0x7f);
  auVar202 = vdpps_avx(auVar95,local_3b0,0x7f);
  auVar144 = vdpps_avx(auVar95,local_3e0,0x7f);
  auVar64 = vdpps_avx(auVar95,local_3f0,0x7f);
  auVar100 = vdpps_avx(auVar95,local_400,0x7f);
  auVar130 = vdpps_avx(auVar95,local_410,0x7f);
  fVar159 = 1.0 - fVar193;
  auVar63 = vdpps_avx(auVar95,local_3c0,0x7f);
  auVar95 = vdpps_avx(auVar95,local_3d0,0x7f);
  fVar197 = 1.0 - fVar149;
  fVar157 = auVar122._4_4_;
  fVar194 = auVar122._8_4_;
  fVar158 = auVar122._12_4_;
  fVar195 = fVar197 * fVar149 * fVar149 * 3.0;
  auVar190._0_4_ = fVar149 * fVar149 * fVar149;
  auVar190._4_4_ = fVar157 * fVar157 * fVar157;
  auVar190._8_4_ = fVar194 * fVar194 * fVar194;
  auVar190._12_4_ = fVar158 * fVar158 * fVar158;
  fVar157 = fVar149 * 3.0 * fVar197 * fVar197;
  fVar194 = fVar197 * fVar197 * fVar197;
  fVar149 = (fVar159 * auVar69._0_4_ + fVar193 * auVar144._0_4_) * fVar194 +
            (fVar159 * auVar202._0_4_ + fVar193 * auVar64._0_4_) * fVar157 +
            fVar195 * (fVar159 * auVar63._0_4_ + fVar193 * auVar100._0_4_) +
            auVar190._0_4_ * (auVar130._0_4_ * fVar193 + fVar159 * auVar95._0_4_);
  if ((fVar149 < fVar177) || (fVar193 = *(float *)(ray + k * 4 + 0x100), fVar193 < fVar149))
  goto LAB_007d42e2;
  pGVar5 = (context->scene->geometries).items[uVar53].ptr;
  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar51 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_007d52a5;
    local_f0 = vshufps_avx(auVar122,auVar122,0x55);
    auVar231._8_4_ = 0x3f800000;
    auVar231._0_8_ = 0x3f8000003f800000;
    auVar231._12_4_ = 0x3f800000;
    auVar69 = vsubps_avx(auVar231,local_f0);
    fVar158 = local_f0._0_4_;
    fVar159 = local_f0._4_4_;
    fVar210 = local_f0._8_4_;
    fVar211 = local_f0._12_4_;
    fVar212 = auVar69._0_4_;
    fVar88 = auVar69._4_4_;
    fVar89 = auVar69._8_4_;
    fVar90 = auVar69._12_4_;
    auVar248._0_4_ = fVar158 * (float)local_4e0._0_4_ + fVar212 * (float)local_4d0._0_4_;
    auVar248._4_4_ = fVar159 * (float)local_4e0._4_4_ + fVar88 * (float)local_4d0._4_4_;
    auVar248._8_4_ = fVar210 * fStack_4d8 + fVar89 * fStack_4c8;
    auVar248._12_4_ = fVar211 * fStack_4d4 + fVar90 * fStack_4c4;
    auVar262._0_4_ = fVar158 * (float)local_530._0_4_ + fVar212 * (float)local_510._0_4_;
    auVar262._4_4_ = fVar159 * (float)local_530._4_4_ + fVar88 * (float)local_510._4_4_;
    auVar262._8_4_ = fVar210 * fStack_528 + fVar89 * fStack_508;
    auVar262._12_4_ = fVar211 * fStack_524 + fVar90 * fStack_504;
    auVar270._0_4_ = fVar158 * (float)local_440._0_4_ + fVar212 * (float)local_520._0_4_;
    auVar270._4_4_ = fVar159 * (float)local_440._4_4_ + fVar88 * (float)local_520._4_4_;
    auVar270._8_4_ = fVar210 * fStack_438 + fVar89 * fStack_518;
    auVar270._12_4_ = fVar211 * fStack_434 + fVar90 * fStack_514;
    auVar232._0_4_ = fVar158 * (float)local_500._0_4_ + fVar212 * (float)local_4f0._0_4_;
    auVar232._4_4_ = fVar159 * (float)local_500._4_4_ + fVar88 * (float)local_4f0._4_4_;
    auVar232._8_4_ = fVar210 * fStack_4f8 + fVar89 * fStack_4e8;
    auVar232._12_4_ = fVar211 * fStack_4f4 + fVar90 * fStack_4e4;
    auVar64 = vsubps_avx(auVar262,auVar248);
    auVar100 = vsubps_avx(auVar270,auVar262);
    auVar130 = vsubps_avx(auVar232,auVar270);
    local_110 = vshufps_avx(auVar122,auVar122,0);
    fVar158 = local_110._0_4_;
    fVar210 = local_110._4_4_;
    fVar211 = local_110._8_4_;
    fVar88 = local_110._12_4_;
    auVar69 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
    fVar159 = auVar69._0_4_;
    fVar197 = auVar69._4_4_;
    fVar212 = auVar69._8_4_;
    fVar89 = auVar69._12_4_;
    auVar69 = vshufps_avx(auVar190,auVar190,0);
    auVar202 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
    auVar144 = vshufps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),0);
    auVar173._0_4_ =
         ((auVar100._0_4_ * fVar159 + auVar130._0_4_ * fVar158) * fVar158 +
         (auVar64._0_4_ * fVar159 + auVar100._0_4_ * fVar158) * fVar159) * 3.0;
    auVar173._4_4_ =
         ((auVar100._4_4_ * fVar197 + auVar130._4_4_ * fVar210) * fVar210 +
         (auVar64._4_4_ * fVar197 + auVar100._4_4_ * fVar210) * fVar197) * 3.0;
    auVar173._8_4_ =
         ((auVar100._8_4_ * fVar212 + auVar130._8_4_ * fVar211) * fVar211 +
         (auVar64._8_4_ * fVar212 + auVar100._8_4_ * fVar211) * fVar212) * 3.0;
    auVar173._12_4_ =
         ((auVar100._12_4_ * fVar89 + auVar130._12_4_ * fVar88) * fVar88 +
         (auVar64._12_4_ * fVar89 + auVar100._12_4_ * fVar88) * fVar89) * 3.0;
    auVar64 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
    auVar113._0_4_ =
         auVar64._0_4_ * (float)local_450._0_4_ +
         auVar144._0_4_ * (float)local_460._0_4_ +
         auVar69._0_4_ * (float)local_480._0_4_ + auVar202._0_4_ * (float)local_470._0_4_;
    auVar113._4_4_ =
         auVar64._4_4_ * (float)local_450._4_4_ +
         auVar144._4_4_ * (float)local_460._4_4_ +
         auVar69._4_4_ * (float)local_480._4_4_ + auVar202._4_4_ * (float)local_470._4_4_;
    auVar113._8_4_ =
         auVar64._8_4_ * fStack_448 +
         auVar144._8_4_ * fStack_458 + auVar69._8_4_ * fStack_478 + auVar202._8_4_ * fStack_468;
    auVar113._12_4_ =
         auVar64._12_4_ * fStack_444 +
         auVar144._12_4_ * fStack_454 + auVar69._12_4_ * fStack_474 + auVar202._12_4_ * fStack_464;
    auVar69 = vshufps_avx(auVar173,auVar173,0xc9);
    auVar145._0_4_ = auVar113._0_4_ * auVar69._0_4_;
    auVar145._4_4_ = auVar113._4_4_ * auVar69._4_4_;
    auVar145._8_4_ = auVar113._8_4_ * auVar69._8_4_;
    auVar145._12_4_ = auVar113._12_4_ * auVar69._12_4_;
    auVar69 = vshufps_avx(auVar113,auVar113,0xc9);
    auVar114._0_4_ = auVar173._0_4_ * auVar69._0_4_;
    auVar114._4_4_ = auVar173._4_4_ * auVar69._4_4_;
    auVar114._8_4_ = auVar173._8_4_ * auVar69._8_4_;
    auVar114._12_4_ = auVar173._12_4_ * auVar69._12_4_;
    auVar69 = vsubps_avx(auVar114,auVar145);
    local_170 = vshufps_avx(auVar69,auVar69,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar69,auVar69,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar69,auVar69,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_320._0_8_;
    uStack_d8 = local_320._8_8_;
    uStack_d0 = local_320._16_8_;
    uStack_c8 = local_320._24_8_;
    local_c0 = local_300;
    vcmpps_avx(local_300,local_300,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar149;
    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar58 & 0xf) << 4));
    local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar58 >> 4) * 0x10);
    local_4b0.valid = (int *)local_580;
    local_4b0.geometryUserPtr = pGVar5->userPtr;
    local_4b0.context = context->user;
    local_4b0.ray = (RTCRayN *)ray;
    local_4b0.hit = local_180;
    local_4b0.N = 8;
    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar5->occlusionFilterN)(&local_4b0);
    }
    auVar69 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
    auVar202 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
    auVar148._16_16_ = auVar202;
    auVar148._0_16_ = auVar69;
    auVar81 = _DAT_01f7b020 & ~auVar148;
    if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar81 >> 0x7f,0) != '\0') ||
          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar81 >> 0xbf,0) != '\0') ||
        (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar81[0x1f] < '\0')
    {
      p_Var6 = context->args->filter;
      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var6)(&local_4b0);
      }
      auVar69 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
      auVar202 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
      auVar87._16_16_ = auVar202;
      auVar87._0_16_ = auVar69;
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar81 = vblendvps_avx(auVar119,*(undefined1 (*) [32])(local_4b0.ray + 0x100),auVar87);
      *(undefined1 (*) [32])(local_4b0.ray + 0x100) = auVar81;
      auVar81 = _DAT_01f7b020 & ~auVar87;
      if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar81 >> 0x7f,0) != '\0') ||
            (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar81 >> 0xbf,0) != '\0') ||
          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar81[0x1f] < '\0') {
        bVar51 = 1;
        goto LAB_007d52a5;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar193;
  }
  bVar51 = 0;
LAB_007d52a5:
  bVar61 = (bool)(bVar61 | bVar51);
  goto LAB_007d42e2;
LAB_007d52c4:
  auVar69 = vinsertps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar149),0x10);
  auVar298 = ZEXT1664(auVar69);
  auVar296 = ZEXT1664(auVar208);
  goto LAB_007d3c73;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }